

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  float fVar3;
  long lVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [32];
  size_t k;
  RayK<8> *pRVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  int iVar51;
  uint uVar52;
  AABBNodeMB4D *node1;
  ulong uVar53;
  RayK<8> *pRVar54;
  long lVar55;
  undefined1 (*pauVar56) [32];
  NodeRef root;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  RayK<8> *pRVar60;
  RayK<8> *pRVar61;
  ulong *puVar62;
  uint uVar63;
  undefined4 uVar64;
  ulong unaff_R15;
  bool bVar65;
  undefined1 auVar66 [16];
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar89;
  float fVar91;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar87;
  float fVar88;
  float fVar90;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 in_ZMM1 [64];
  undefined1 auVar86 [64];
  float fVar95;
  float fVar107;
  float fVar108;
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar109;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar106 [64];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar127;
  float fVar128;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar129;
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar139 [64];
  float fVar146;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar152 [64];
  undefined1 auVar159 [28];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar182;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 in_ZMM11 [64];
  float fVar199;
  undefined1 auVar200 [32];
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 in_ZMM12 [64];
  float fVar207;
  undefined1 auVar208 [32];
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 in_ZMM13 [64];
  undefined1 auVar215 [28];
  undefined1 in_ZMM14 [64];
  float fVar216;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 in_ZMM15 [64];
  vuint<4> *v;
  Precalculations pre;
  vint<8> itime;
  Vec3<embree::vfloat_impl<8>_> p1;
  vbool<8> terminated;
  Vec3<embree::vfloat_impl<8>_> p0;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2d19;
  ulong local_2d18;
  RayQueryContext *local_2d10;
  RayK<8> *local_2d08;
  undefined1 local_2d00 [8];
  undefined1 auStack_2cf8 [8];
  float fStack_2cf0;
  float fStack_2cec;
  float fStack_2ce8;
  float fStack_2ce4;
  ulong local_2cd0;
  RayK<8> *local_2cc8;
  undefined1 local_2cc0 [32];
  undefined1 local_2ca0 [32];
  undefined8 local_2c80;
  float fStack_2c78;
  float fStack_2c74;
  float fStack_2c70;
  float fStack_2c6c;
  float fStack_2c68;
  float local_2c60 [4];
  float fStack_2c50;
  float fStack_2c4c;
  float fStack_2c48;
  undefined1 local_2c40 [32];
  undefined1 local_2c20 [32];
  BVH *local_2c00;
  Intersectors *local_2bf8;
  RayK<8> *local_2bf0;
  ulong local_2be8;
  undefined1 local_2be0 [32];
  undefined1 local_2bc0 [32];
  undefined1 local_2ba0 [32];
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 local_2b70;
  undefined8 uStack_2b68;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined1 local_2b20 [8];
  float fStack_2b18;
  float fStack_2b14;
  float fStack_2b10;
  float fStack_2b0c;
  float fStack_2b08;
  undefined1 local_2b00 [32];
  undefined1 local_2ae0 [32];
  undefined4 local_2ac0;
  undefined4 uStack_2abc;
  undefined4 uStack_2ab8;
  undefined4 uStack_2ab4;
  undefined4 uStack_2ab0;
  undefined4 uStack_2aac;
  undefined4 uStack_2aa8;
  undefined4 uStack_2aa4;
  uint local_2aa0;
  uint uStack_2a9c;
  uint uStack_2a98;
  uint uStack_2a94;
  uint uStack_2a90;
  uint uStack_2a8c;
  uint uStack_2a88;
  uint uStack_2a84;
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2a40;
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [8];
  float fStack_2938;
  float fStack_2934;
  float fStack_2930;
  float fStack_292c;
  float fStack_2928;
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined1 local_27c0 [8];
  float fStack_27b8;
  float fStack_27b4;
  float fStack_27b0;
  float fStack_27ac;
  float fStack_27a8;
  undefined1 local_27a0 [8];
  float fStack_2798;
  float fStack_2794;
  float fStack_2790;
  float fStack_278c;
  float fStack_2788;
  undefined1 local_2780 [32];
  float local_2760;
  float fStack_275c;
  float fStack_2758;
  float fStack_2754;
  float fStack_2750;
  float fStack_274c;
  float fStack_2748;
  undefined4 uStack_2744;
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar80 [32];
  undefined1 auVar181 [64];
  undefined1 auVar185 [64];
  
  local_2608 = (((BVH *)This->ptr)->root).ptr;
  if (local_2608 != 8) {
    auVar81 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar96 = ZEXT816(0) << 0x40;
    auVar67 = vpcmpeqd_avx2(auVar81,(undefined1  [32])valid_i->field_0);
    auVar81 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar96),5);
    auVar97 = auVar67 & auVar81;
    if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar97 >> 0x7f,0) != '\0') ||
          (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar97 >> 0xbf,0) != '\0') ||
        (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar97[0x1f] < '\0')
    {
      auVar81 = vandps_avx(auVar81,auVar67);
      auVar66 = vpackssdw_avx(auVar81._0_16_,auVar81._16_16_);
      local_2a40._0_8_ = *(undefined8 *)ray;
      local_2a40._8_8_ = *(undefined8 *)(ray + 8);
      local_2a40._16_8_ = *(undefined8 *)(ray + 0x10);
      local_2a40._24_8_ = *(undefined8 *)(ray + 0x18);
      local_2a40._32_8_ = *(undefined8 *)(ray + 0x20);
      local_2a40._40_8_ = *(undefined8 *)(ray + 0x28);
      local_2a40._48_8_ = *(undefined8 *)(ray + 0x30);
      local_2a40._56_8_ = *(undefined8 *)(ray + 0x38);
      local_2a40._64_8_ = *(undefined8 *)(ray + 0x40);
      local_2a40._72_8_ = *(undefined8 *)(ray + 0x48);
      local_2a40._80_8_ = *(undefined8 *)(ray + 0x50);
      local_2a40._88_8_ = *(undefined8 *)(ray + 0x58);
      local_29e0 = *(undefined1 (*) [32])(ray + 0x80);
      local_29c0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_29a0 = *(undefined1 (*) [32])(ray + 0xc0);
      local_2ba0._8_4_ = 0x7fffffff;
      local_2ba0._0_8_ = 0x7fffffff7fffffff;
      local_2ba0._12_4_ = 0x7fffffff;
      local_2ba0._16_4_ = 0x7fffffff;
      local_2ba0._20_4_ = 0x7fffffff;
      local_2ba0._24_4_ = 0x7fffffff;
      local_2ba0._28_4_ = 0x7fffffff;
      auVar174._8_4_ = 0x219392ef;
      auVar174._0_8_ = 0x219392ef219392ef;
      auVar174._12_4_ = 0x219392ef;
      auVar174._16_4_ = 0x219392ef;
      auVar174._20_4_ = 0x219392ef;
      auVar174._24_4_ = 0x219392ef;
      auVar174._28_4_ = 0x219392ef;
      auVar183._8_4_ = 0x3f800000;
      auVar183._0_8_ = 0x3f8000003f800000;
      auVar183._12_4_ = 0x3f800000;
      auVar183._16_4_ = 0x3f800000;
      auVar183._20_4_ = 0x3f800000;
      auVar183._24_4_ = 0x3f800000;
      auVar183._28_4_ = 0x3f800000;
      auVar185 = ZEXT3264(auVar183);
      auVar82 = vdivps_avx(auVar183,local_29e0);
      auVar81 = vandps_avx(local_2ba0,local_29e0);
      auVar97 = vcmpps_avx(auVar81,auVar174,1);
      auVar81 = vandps_avx(local_2ba0,local_29c0);
      auVar67 = vcmpps_avx(auVar81,auVar174,1);
      auVar165 = ZEXT3264(auVar67);
      auVar113 = vdivps_avx(auVar183,local_29c0);
      auVar81 = vandps_avx(local_2ba0,local_29a0);
      auVar81 = vcmpps_avx(auVar81,auVar174,1);
      auVar173 = ZEXT3264(auVar81);
      auVar121 = vdivps_avx(auVar183,local_29a0);
      auVar175._8_4_ = 0x5d5e0b6b;
      auVar175._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar175._12_4_ = 0x5d5e0b6b;
      auVar175._16_4_ = 0x5d5e0b6b;
      auVar175._20_4_ = 0x5d5e0b6b;
      auVar175._24_4_ = 0x5d5e0b6b;
      auVar175._28_4_ = 0x5d5e0b6b;
      auVar181 = ZEXT3264(auVar175);
      local_2980 = vblendvps_avx(auVar82,auVar175,auVar97);
      local_2960 = vblendvps_avx(auVar113,auVar175,auVar67);
      _local_2940 = vblendvps_avx(auVar121,auVar175,auVar81);
      auVar81 = vcmpps_avx(local_2980,ZEXT1632(auVar96),1);
      auVar97._8_4_ = 0x10;
      auVar97._0_8_ = 0x1000000010;
      auVar97._12_4_ = 0x10;
      auVar97._16_4_ = 0x10;
      auVar97._20_4_ = 0x10;
      auVar97._24_4_ = 0x10;
      auVar97._28_4_ = 0x10;
      local_2920 = vandps_avx(auVar81,auVar97);
      auVar82._8_4_ = 0x20;
      auVar82._0_8_ = 0x2000000020;
      auVar82._12_4_ = 0x20;
      auVar82._16_4_ = 0x20;
      auVar82._20_4_ = 0x20;
      auVar82._24_4_ = 0x20;
      auVar82._28_4_ = 0x20;
      auVar80._8_4_ = 0x30;
      auVar80._0_8_ = 0x3000000030;
      auVar80._12_4_ = 0x30;
      auVar80._16_4_ = 0x30;
      auVar80._20_4_ = 0x30;
      auVar80._24_4_ = 0x30;
      auVar80._28_4_ = 0x30;
      auVar152 = ZEXT3264(auVar80);
      auVar97 = ZEXT1632(auVar96);
      auVar81 = vcmpps_avx(local_2960,auVar97,5);
      local_2900 = vblendvps_avx(auVar80,auVar82,auVar81);
      auVar113._8_4_ = 0x40;
      auVar113._0_8_ = 0x4000000040;
      auVar113._12_4_ = 0x40;
      auVar113._16_4_ = 0x40;
      auVar113._20_4_ = 0x40;
      auVar113._24_4_ = 0x40;
      auVar113._28_4_ = 0x40;
      auVar121._8_4_ = 0x50;
      auVar121._0_8_ = 0x5000000050;
      auVar121._12_4_ = 0x50;
      auVar121._16_4_ = 0x50;
      auVar121._20_4_ = 0x50;
      auVar121._24_4_ = 0x50;
      auVar121._28_4_ = 0x50;
      auVar81 = vcmpps_avx(_local_2940,auVar97,5);
      auVar139 = ZEXT3264(auVar81);
      local_28e0 = vblendvps_avx(auVar121,auVar113,auVar81);
      auVar81 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar97);
      auVar97 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar97);
      local_2880 = vpmovsxwd_avx2(auVar66);
      auVar67._8_4_ = 0x7f800000;
      auVar67._0_8_ = 0x7f8000007f800000;
      auVar67._12_4_ = 0x7f800000;
      auVar67._16_4_ = 0x7f800000;
      auVar67._20_4_ = 0x7f800000;
      auVar67._24_4_ = 0x7f800000;
      auVar67._28_4_ = 0x7f800000;
      local_28c0 = vblendvps_avx(auVar67,auVar81,local_2880);
      auVar81._8_4_ = 0xff800000;
      auVar81._0_8_ = 0xff800000ff800000;
      auVar81._12_4_ = 0xff800000;
      auVar81._16_4_ = 0xff800000;
      auVar81._20_4_ = 0xff800000;
      auVar81._24_4_ = 0xff800000;
      auVar81._28_4_ = 0xff800000;
      local_28a0 = vblendvps_avx(auVar81,auVar97,local_2880);
      auVar96 = vpcmpeqd_avx(local_28a0._0_16_,local_28a0._0_16_);
      local_2be0 = vpmovsxwd_avx2(auVar66 ^ auVar96);
      local_2bf8 = This;
      local_2c00 = (BVH *)This->ptr;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar59 = 5;
      }
      else {
        uVar59 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2cc8 = ray + 0x100;
      puVar62 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar56 = (undefined1 (*) [32])local_1e40;
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      local_1e60 = local_28c0;
      auVar81 = vpcmpeqd_avx2(local_1e80,local_1e80);
      auVar86 = ZEXT3264(auVar81);
      local_2d18 = uVar59;
      local_2d10 = context;
LAB_019d172b:
      do {
        do {
          root.ptr = puVar62[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_019d2806;
          puVar62 = puVar62 + -1;
          pauVar56 = pauVar56 + -1;
          _local_2d00 = *pauVar56;
          auVar106 = ZEXT3264(_local_2d00);
          auVar81 = vcmpps_avx(_local_2d00,local_28a0,1);
        } while ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar81 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar81 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar81 >> 0x7f,0) == '\0') &&
                   (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar81 >> 0xbf,0) == '\0') &&
                 (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar81[0x1f]);
        uVar64 = vmovmskps_avx(auVar81);
        unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar64);
        if (uVar59 < CONCAT44(0,POPCOUNT(uVar64))) {
LAB_019d1769:
          do {
            uVar63 = (uint)root.ptr;
            auVar81 = auVar106._0_32_;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_019d2806;
              auVar97 = vcmpps_avx(local_28a0,auVar81,6);
              if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar97 >> 0x7f,0) != '\0') ||
                    (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar97 >> 0xbf,0) != '\0') ||
                  (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar97[0x1f] < '\0') {
                pRVar54 = (RayK<8> *)((ulong)(uVar63 & 0xf) - 8);
                local_2bf0 = pRVar54;
                if (pRVar54 == (RayK<8> *)0x0) {
                  auVar97 = vpcmpeqd_avx2(auVar81,auVar81);
                  auVar84 = local_2be0;
                }
                else {
                  auVar81 = local_2be0 ^ auVar86._0_32_;
                  pRVar61 = (RayK<8> *)0x0;
                  do {
                    auVar86 = ZEXT3264(auVar81);
                    lVar55 = (long)pRVar61 * 0x50 + (root.ptr & 0xfffffffffffffff0);
                    uVar52 = vmovmskps_avx(auVar81);
                    pRVar54 = (RayK<8> *)CONCAT44((int)((ulong)pRVar54 >> 0x20),uVar52);
                    uVar63 = 0;
                    for (; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x80000000) {
                      uVar63 = uVar63 + 1;
                    }
                    local_2be8 = (ulong)uVar63;
                    local_2cd0 = 0;
                    for (pRVar60 = pRVar54; ((ulong)pRVar60 & 1) == 0;
                        pRVar60 = (RayK<8> *)((ulong)pRVar60 >> 1 | 0x8000000000000000)) {
                      local_2cd0 = local_2cd0 + 1;
                    }
                    local_2bc0 = auVar81;
                    uVar53 = 0;
                    local_2d08 = pRVar54;
                    auVar119 = auVar81;
                    while( true ) {
                      auVar97 = auVar86._0_32_;
                      auVar168 = auVar173._0_32_;
                      auVar177 = auVar181._0_32_;
                      auVar215 = in_ZMM14._0_28_;
                      auVar159 = auVar165._0_28_;
                      unaff_R15 = uVar53;
                      if (*(int *)(lVar55 + 0x40 + uVar53 * 4) == -1) break;
                      pRVar54 = (RayK<8> *)(context->scene->geometries).items;
                      lVar4 = *(long *)(pRVar54 + (ulong)*(uint *)(lVar55 + 0x30 + uVar53 * 4) * 8);
                      auVar66._8_8_ = 0;
                      auVar66._0_8_ = *(ulong *)(lVar4 + 0x2c);
                      uVar64 = (undefined4)*(ulong *)(lVar4 + 0x2c);
                      auVar76._4_4_ = uVar64;
                      auVar76._0_4_ = uVar64;
                      auVar76._8_4_ = uVar64;
                      auVar76._12_4_ = uVar64;
                      auVar76._16_4_ = uVar64;
                      auVar76._20_4_ = uVar64;
                      auVar76._24_4_ = uVar64;
                      auVar76._28_4_ = uVar64;
                      auVar81 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar76);
                      auVar96 = vmovshdup_avx(auVar66);
                      auVar96 = vsubps_avx(auVar96,auVar66);
                      auVar68._0_4_ = auVar96._0_4_;
                      auVar68._4_4_ = auVar68._0_4_;
                      auVar68._8_4_ = auVar68._0_4_;
                      auVar68._12_4_ = auVar68._0_4_;
                      auVar68._16_4_ = auVar68._0_4_;
                      auVar68._20_4_ = auVar68._0_4_;
                      auVar68._24_4_ = auVar68._0_4_;
                      auVar68._28_4_ = auVar68._0_4_;
                      auVar81 = vdivps_avx(auVar81,auVar68);
                      fVar74 = *(float *)(lVar4 + 0x28);
                      auVar15._4_4_ = fVar74 * auVar81._4_4_;
                      auVar15._0_4_ = fVar74 * auVar81._0_4_;
                      auVar15._8_4_ = fVar74 * auVar81._8_4_;
                      auVar15._12_4_ = fVar74 * auVar81._12_4_;
                      auVar15._16_4_ = fVar74 * auVar81._16_4_;
                      auVar15._20_4_ = fVar74 * auVar81._20_4_;
                      auVar15._24_4_ = fVar74 * auVar81._24_4_;
                      auVar15._28_4_ = auVar81._28_4_;
                      auVar81 = vroundps_avx(auVar15,1);
                      fVar74 = fVar74 + -1.0;
                      auVar77._4_4_ = fVar74;
                      auVar77._0_4_ = fVar74;
                      auVar77._8_4_ = fVar74;
                      auVar77._12_4_ = fVar74;
                      auVar77._16_4_ = fVar74;
                      auVar77._20_4_ = fVar74;
                      auVar77._24_4_ = fVar74;
                      auVar77._28_4_ = fVar74;
                      auVar81 = vminps_avx(auVar81,auVar77);
                      auVar81 = vmaxps_avx(auVar81,_DAT_01faff00);
                      auVar67 = vsubps_avx(auVar15,auVar81);
                      local_2cc0 = vcvtps2dq_avx(auVar81);
                      iVar51 = *(int *)(local_2cc0 + local_2be8 * 4);
                      auVar98._4_4_ = iVar51;
                      auVar98._0_4_ = iVar51;
                      auVar98._8_4_ = iVar51;
                      auVar98._12_4_ = iVar51;
                      auVar98._16_4_ = iVar51;
                      auVar98._20_4_ = iVar51;
                      auVar98._24_4_ = iVar51;
                      auVar98._28_4_ = iVar51;
                      auVar7 = vpcmpeqd_avx2(auVar98,local_2cc0);
                      auVar97 = auVar97 & ~auVar7;
                      local_2c20 = auVar119;
                      fVar74 = auVar67._0_4_;
                      fVar87 = auVar67._4_4_;
                      fVar89 = auVar67._8_4_;
                      fVar91 = auVar67._12_4_;
                      fVar71 = auVar67._16_4_;
                      fVar72 = auVar67._20_4_;
                      fVar73 = auVar67._24_4_;
                      auVar165._28_36_ = in_ZMM15._28_36_;
                      if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar97 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar97 >> 0x7f,0) == '\0') &&
                            (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar97 >> 0xbf,0) == '\0') &&
                          (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar97[0x1f]) {
                        lVar5 = *(long *)(*(long *)(lVar4 + 0xe0) + (long)iVar51 * 0x38);
                        lVar4 = *(long *)(*(long *)(lVar4 + 0xe0) + 0x38 + (long)iVar51 * 0x38);
                        uVar57 = (ulong)*(uint *)(lVar55 + uVar53 * 4);
                        uVar58 = (ulong)*(uint *)(lVar55 + 0x10 + uVar53 * 4);
                        uVar64 = *(undefined4 *)(lVar5 + uVar57 * 4);
                        auVar137._4_4_ = uVar64;
                        auVar137._0_4_ = uVar64;
                        auVar137._8_4_ = uVar64;
                        auVar137._12_4_ = uVar64;
                        auVar137._16_4_ = uVar64;
                        auVar137._20_4_ = uVar64;
                        auVar137._24_4_ = uVar64;
                        auVar137._28_4_ = uVar64;
                        uVar64 = *(undefined4 *)(lVar5 + 4 + uVar57 * 4);
                        auVar148._4_4_ = uVar64;
                        auVar148._0_4_ = uVar64;
                        auVar148._8_4_ = uVar64;
                        auVar148._12_4_ = uVar64;
                        auVar148._16_4_ = uVar64;
                        auVar148._20_4_ = uVar64;
                        auVar148._24_4_ = uVar64;
                        auVar148._28_4_ = uVar64;
                        uVar64 = *(undefined4 *)(lVar5 + 8 + uVar57 * 4);
                        auVar163._4_4_ = uVar64;
                        auVar163._0_4_ = uVar64;
                        auVar163._8_4_ = uVar64;
                        auVar163._12_4_ = uVar64;
                        auVar163._16_4_ = uVar64;
                        auVar163._20_4_ = uVar64;
                        auVar163._24_4_ = uVar64;
                        auVar163._28_4_ = uVar64;
                        fVar95 = *(float *)(lVar4 + uVar57 * 4);
                        fVar107 = *(float *)(lVar4 + 4 + uVar57 * 4);
                        fVar108 = *(float *)(lVar4 + 8 + uVar57 * 4);
                        auVar99._8_4_ = 0x3f800000;
                        auVar99._0_8_ = 0x3f8000003f800000;
                        auVar99._12_4_ = 0x3f800000;
                        auVar99._16_4_ = 0x3f800000;
                        auVar99._20_4_ = 0x3f800000;
                        auVar99._24_4_ = 0x3f800000;
                        auVar99._28_4_ = 0x3f800000;
                        auVar81 = vsubps_avx(auVar99,auVar67);
                        auVar16._4_4_ = fVar87 * fVar95;
                        auVar16._0_4_ = fVar74 * fVar95;
                        auVar16._8_4_ = fVar89 * fVar95;
                        auVar16._12_4_ = fVar91 * fVar95;
                        auVar16._16_4_ = fVar71 * fVar95;
                        auVar16._20_4_ = fVar72 * fVar95;
                        auVar16._24_4_ = fVar73 * fVar95;
                        auVar16._28_4_ = fVar95;
                        auVar165._0_4_ = fVar74 * fVar107;
                        auVar165._4_4_ = fVar87 * fVar107;
                        auVar165._8_4_ = fVar89 * fVar107;
                        auVar165._12_4_ = fVar91 * fVar107;
                        auVar165._16_4_ = fVar71 * fVar107;
                        auVar165._20_4_ = fVar72 * fVar107;
                        auVar165._24_4_ = fVar73 * fVar107;
                        auVar17._4_4_ = fVar87 * fVar108;
                        auVar17._0_4_ = fVar74 * fVar108;
                        auVar17._8_4_ = fVar89 * fVar108;
                        auVar17._12_4_ = fVar91 * fVar108;
                        auVar17._16_4_ = fVar71 * fVar108;
                        auVar17._20_4_ = fVar72 * fVar108;
                        auVar17._24_4_ = fVar73 * fVar108;
                        auVar17._28_4_ = fVar108;
                        auVar96 = vfmadd231ps_fma(auVar16,auVar81,auVar137);
                        _local_2d00 = ZEXT1632(auVar96);
                        auVar96 = vfmadd231ps_fma(auVar165._0_32_,auVar81,auVar148);
                        auVar218 = ZEXT1632(auVar96);
                        uVar64 = *(undefined4 *)(lVar5 + uVar58 * 4);
                        auVar169._4_4_ = uVar64;
                        auVar169._0_4_ = uVar64;
                        auVar169._8_4_ = uVar64;
                        auVar169._12_4_ = uVar64;
                        auVar169._16_4_ = uVar64;
                        auVar169._20_4_ = uVar64;
                        auVar169._24_4_ = uVar64;
                        auVar169._28_4_ = uVar64;
                        uVar64 = *(undefined4 *)(lVar5 + 4 + uVar58 * 4);
                        auVar178._4_4_ = uVar64;
                        auVar178._0_4_ = uVar64;
                        auVar178._8_4_ = uVar64;
                        auVar178._12_4_ = uVar64;
                        auVar178._16_4_ = uVar64;
                        auVar178._20_4_ = uVar64;
                        auVar178._24_4_ = uVar64;
                        auVar178._28_4_ = uVar64;
                        uVar64 = *(undefined4 *)(lVar5 + 8 + uVar58 * 4);
                        auVar184._4_4_ = uVar64;
                        auVar184._0_4_ = uVar64;
                        auVar184._8_4_ = uVar64;
                        auVar184._12_4_ = uVar64;
                        auVar184._16_4_ = uVar64;
                        auVar184._20_4_ = uVar64;
                        auVar184._24_4_ = uVar64;
                        auVar184._28_4_ = uVar64;
                        fVar95 = *(float *)(lVar4 + uVar58 * 4);
                        fVar108 = *(float *)(lVar4 + 4 + uVar58 * 4);
                        auVar96 = vfmadd231ps_fma(auVar17,auVar81,auVar163);
                        auVar126 = ZEXT1632(auVar96);
                        fVar109 = *(float *)(lVar4 + 8 + uVar58 * 4);
                        auVar78._0_4_ = fVar74 * fVar95;
                        auVar78._4_4_ = fVar87 * fVar95;
                        auVar78._8_4_ = fVar89 * fVar95;
                        auVar78._12_4_ = fVar91 * fVar95;
                        auVar78._16_4_ = fVar71 * fVar95;
                        auVar78._20_4_ = fVar72 * fVar95;
                        auVar78._24_4_ = fVar73 * fVar95;
                        auVar78._28_4_ = 0;
                        auVar18._4_4_ = fVar87 * fVar108;
                        auVar18._0_4_ = fVar74 * fVar108;
                        auVar18._8_4_ = fVar89 * fVar108;
                        auVar18._12_4_ = fVar91 * fVar108;
                        auVar18._16_4_ = fVar71 * fVar108;
                        auVar18._20_4_ = fVar72 * fVar108;
                        auVar18._24_4_ = fVar73 * fVar108;
                        auVar18._28_4_ = fVar108;
                        auVar19._4_4_ = fVar87 * fVar109;
                        auVar19._0_4_ = fVar74 * fVar109;
                        auVar19._8_4_ = fVar89 * fVar109;
                        auVar19._12_4_ = fVar91 * fVar109;
                        auVar19._16_4_ = fVar71 * fVar109;
                        auVar19._20_4_ = fVar72 * fVar109;
                        auVar19._24_4_ = fVar73 * fVar109;
                        auVar19._28_4_ = fVar107;
                        auVar96 = vfmadd231ps_fma(auVar78,auVar81,auVar169);
                        auVar83 = ZEXT1632(auVar96);
                        auVar96 = vfmadd231ps_fma(auVar18,auVar81,auVar178);
                        auVar151 = ZEXT1632(auVar96);
                        auVar96 = vfmadd231ps_fma(auVar19,auVar81,auVar184);
                        auVar120 = ZEXT1632(auVar96);
                        uVar57 = (ulong)*(uint *)(lVar55 + 0x20 + uVar53 * 4);
                        uVar64 = *(undefined4 *)(lVar5 + uVar57 * 4);
                        auVar179._4_4_ = uVar64;
                        auVar179._0_4_ = uVar64;
                        auVar179._8_4_ = uVar64;
                        auVar179._12_4_ = uVar64;
                        auVar179._16_4_ = uVar64;
                        auVar179._20_4_ = uVar64;
                        auVar179._24_4_ = uVar64;
                        auVar179._28_4_ = uVar64;
                        uVar64 = *(undefined4 *)(lVar5 + 4 + uVar57 * 4);
                        auVar200._4_4_ = uVar64;
                        auVar200._0_4_ = uVar64;
                        auVar200._8_4_ = uVar64;
                        auVar200._12_4_ = uVar64;
                        auVar200._16_4_ = uVar64;
                        auVar200._20_4_ = uVar64;
                        auVar200._24_4_ = uVar64;
                        auVar200._28_4_ = uVar64;
                        uVar64 = *(undefined4 *)(lVar5 + 8 + uVar57 * 4);
                        auVar208._4_4_ = uVar64;
                        auVar208._0_4_ = uVar64;
                        auVar208._8_4_ = uVar64;
                        auVar208._12_4_ = uVar64;
                        auVar208._16_4_ = uVar64;
                        auVar208._20_4_ = uVar64;
                        auVar208._24_4_ = uVar64;
                        auVar208._28_4_ = uVar64;
                        fVar95 = *(float *)(lVar4 + uVar57 * 4);
                        fVar107 = *(float *)(lVar4 + 4 + uVar57 * 4);
                        fVar108 = *(float *)(lVar4 + 8 + uVar57 * 4);
                        auVar20._4_4_ = fVar95 * fVar87;
                        auVar20._0_4_ = fVar95 * fVar74;
                        auVar20._8_4_ = fVar95 * fVar89;
                        auVar20._12_4_ = fVar95 * fVar91;
                        auVar20._16_4_ = fVar95 * fVar71;
                        auVar20._20_4_ = fVar95 * fVar72;
                        auVar20._24_4_ = fVar95 * fVar73;
                        auVar20._28_4_ = fVar95;
                        auVar21._4_4_ = fVar107 * fVar87;
                        auVar21._0_4_ = fVar107 * fVar74;
                        auVar21._8_4_ = fVar107 * fVar89;
                        auVar21._12_4_ = fVar107 * fVar91;
                        auVar21._16_4_ = fVar107 * fVar71;
                        auVar21._20_4_ = fVar107 * fVar72;
                        auVar21._24_4_ = fVar107 * fVar73;
                        auVar21._28_4_ = fVar107;
                        auVar22._4_4_ = fVar108 * fVar87;
                        auVar22._0_4_ = fVar108 * fVar74;
                        auVar22._8_4_ = fVar108 * fVar89;
                        auVar22._12_4_ = fVar108 * fVar91;
                        auVar22._16_4_ = fVar108 * fVar71;
                        auVar22._20_4_ = fVar108 * fVar72;
                        auVar22._24_4_ = fVar108 * fVar73;
                        auVar22._28_4_ = fVar108;
                        auVar96 = vfmadd231ps_fma(auVar20,auVar81,auVar179);
                        auVar172 = ZEXT1632(auVar96);
                        auVar96 = vfmadd231ps_fma(auVar21,auVar81,auVar200);
                        auVar139 = ZEXT1664(auVar96);
                        auVar96 = vfmadd231ps_fma(auVar22,auVar81,auVar208);
                        auVar152 = ZEXT1664(auVar96);
                      }
                      else {
                        if (local_2d08 != (RayK<8> *)0x0) {
                          lVar5 = *(long *)(lVar4 + 0xe0);
                          uVar57 = (ulong)*(uint *)(lVar55 + uVar53 * 4);
                          pRVar60 = local_2d08;
                          uVar59 = local_2cd0;
                          do {
                            puVar1 = (undefined4 *)
                                     (*(long *)(lVar5 + (long)*(int *)(local_2cc0 + uVar59 * 4) *
                                                        0x38) + uVar57 * 4);
                            uVar64 = puVar1[1];
                            uVar41 = puVar1[2];
                            puVar2 = (undefined4 *)
                                     (*(long *)(lVar5 + 0x38 +
                                               (long)*(int *)(local_2cc0 + uVar59 * 4) * 0x38) +
                                     uVar57 * 4);
                            uVar42 = *puVar2;
                            uVar43 = puVar2[1];
                            fVar95 = (float)puVar2[2];
                            *(undefined4 *)((long)&local_2b60 + uVar59 * 4) = *puVar1;
                            *(undefined4 *)((long)&local_2b40 + uVar59 * 4) = uVar64;
                            *(undefined4 *)(local_2b20 + uVar59 * 4) = uVar41;
                            *(undefined4 *)(local_2ca0 + uVar59 * 4) = uVar42;
                            *(undefined4 *)((long)&local_2c80 + uVar59 * 4) = uVar43;
                            local_2c60[uVar59] = fVar95;
                            pRVar60 = (RayK<8> *)((ulong)pRVar60 ^ 1L << (uVar59 & 0x3f));
                            uVar59 = 0;
                            for (pRVar8 = pRVar60; ((ulong)pRVar8 & 1) == 0;
                                pRVar8 = (RayK<8> *)((ulong)pRVar8 >> 1 | 0x8000000000000000)) {
                              uVar59 = uVar59 + 1;
                            }
                          } while (pRVar60 != (RayK<8> *)0x0);
                          auVar119._8_8_ = uStack_2b58;
                          auVar119._0_8_ = local_2b60;
                          auVar119._16_8_ = uStack_2b50;
                          auVar119._24_8_ = uStack_2b48;
                          auVar7._8_8_ = local_2ca0._8_8_;
                          auVar7._0_8_ = local_2ca0._0_8_;
                          auVar7._16_8_ = local_2ca0._16_8_;
                          auVar7._24_8_ = local_2ca0._24_8_;
                          uVar59 = local_2d18;
                          context = local_2d10;
                        }
                        auVar102._8_4_ = 0x3f800000;
                        auVar102._0_8_ = 0x3f8000003f800000;
                        auVar102._12_4_ = 0x3f800000;
                        auVar102._16_4_ = 0x3f800000;
                        auVar102._20_4_ = 0x3f800000;
                        auVar102._24_4_ = 0x3f800000;
                        auVar102._28_4_ = 0x3f800000;
                        auVar81 = vsubps_avx(auVar102,auVar67);
                        fVar95 = auVar81._0_4_;
                        fVar216 = fVar95 * (float)local_2b40;
                        fVar107 = auVar81._4_4_;
                        fVar219 = fVar107 * local_2b40._4_4_;
                        fVar108 = auVar81._8_4_;
                        fVar220 = fVar108 * (float)uStack_2b38;
                        fVar109 = auVar81._12_4_;
                        fVar221 = fVar109 * uStack_2b38._4_4_;
                        fVar110 = auVar81._16_4_;
                        fVar222 = fVar110 * (float)uStack_2b30;
                        fVar111 = auVar81._20_4_;
                        fVar223 = fVar111 * uStack_2b30._4_4_;
                        fVar112 = auVar81._24_4_;
                        fVar224 = fVar112 * (float)uStack_2b28;
                        fVar129 = fVar95 * (float)local_2b20._0_4_;
                        fVar140 = fVar107 * (float)local_2b20._4_4_;
                        fVar141 = fVar108 * fStack_2b18;
                        fVar142 = fVar109 * fStack_2b14;
                        fVar143 = fVar110 * fStack_2b10;
                        fVar144 = fVar111 * fStack_2b0c;
                        fVar145 = fVar112 * fStack_2b08;
                        fVar146 = fVar74 * (float)local_2c80;
                        fVar153 = fVar87 * local_2c80._4_4_;
                        fVar154 = fVar89 * fStack_2c78;
                        fVar155 = fVar91 * fStack_2c74;
                        fVar156 = fVar71 * fStack_2c70;
                        fVar157 = fVar72 * fStack_2c6c;
                        fVar158 = fVar73 * fStack_2c68;
                        fVar88 = fVar74 * local_2c60[0];
                        fVar90 = fVar87 * local_2c60[1];
                        fVar92 = fVar89 * local_2c60[2];
                        fVar93 = fVar91 * local_2c60[3];
                        fVar94 = fVar71 * fStack_2c50;
                        fVar127 = fVar72 * fStack_2c4c;
                        fVar128 = fVar73 * fStack_2c48;
                        if (local_2d08 != (RayK<8> *)0x0) {
                          lVar5 = *(long *)(lVar4 + 0xe0);
                          uVar57 = (ulong)*(uint *)(lVar55 + 0x10 + uVar53 * 4);
                          pRVar60 = local_2d08;
                          uVar59 = local_2cd0;
                          do {
                            auVar96 = *(undefined1 (*) [16])
                                       (*(long *)(lVar5 + (long)*(int *)(local_2cc0 + uVar59 * 4) *
                                                          0x38) + uVar57 * 4);
                            auVar66 = *(undefined1 (*) [16])
                                       (*(long *)(lVar5 + 0x38 +
                                                 (long)*(int *)(local_2cc0 + uVar59 * 4) * 0x38) +
                                       uVar57 * 4);
                            *(int *)((long)&local_2b60 + uVar59 * 4) = auVar96._0_4_;
                            uVar64 = vextractps_avx(auVar96,1);
                            *(undefined4 *)((long)&local_2b40 + uVar59 * 4) = uVar64;
                            uVar64 = vextractps_avx(auVar96,2);
                            *(undefined4 *)(local_2b20 + uVar59 * 4) = uVar64;
                            *(int *)(local_2ca0 + uVar59 * 4) = auVar66._0_4_;
                            uVar64 = vextractps_avx(auVar66,1);
                            *(undefined4 *)((long)&local_2c80 + uVar59 * 4) = uVar64;
                            fVar182 = (float)vextractps_avx(auVar66,2);
                            local_2c60[uVar59] = fVar182;
                            pRVar60 = (RayK<8> *)((ulong)pRVar60 ^ 1L << (uVar59 & 0x3f));
                            uVar59 = 0;
                            for (pRVar8 = pRVar60; ((ulong)pRVar8 & 1) == 0;
                                pRVar8 = (RayK<8> *)((ulong)pRVar8 >> 1 | 0x8000000000000000)) {
                              uVar59 = uVar59 + 1;
                            }
                          } while (pRVar60 != (RayK<8> *)0x0);
                          auVar168._8_8_ = uStack_2b58;
                          auVar168._0_8_ = local_2b60;
                          auVar168._16_8_ = uStack_2b50;
                          auVar168._24_8_ = uStack_2b48;
                          auVar177._8_8_ = local_2ca0._8_8_;
                          auVar177._0_8_ = local_2ca0._0_8_;
                          auVar177._16_8_ = local_2ca0._16_8_;
                          auVar177._24_8_ = local_2ca0._24_8_;
                          uVar59 = local_2d18;
                          context = local_2d10;
                        }
                        fVar182 = fVar95 * (float)local_2b40;
                        fVar186 = fVar107 * local_2b40._4_4_;
                        fVar187 = fVar108 * (float)uStack_2b38;
                        fVar188 = fVar109 * uStack_2b38._4_4_;
                        fVar189 = fVar110 * (float)uStack_2b30;
                        fVar190 = fVar111 * uStack_2b30._4_4_;
                        fVar191 = fVar112 * (float)uStack_2b28;
                        fVar192 = fVar95 * (float)local_2b20._0_4_;
                        fVar193 = fVar107 * (float)local_2b20._4_4_;
                        fVar194 = fVar108 * fStack_2b18;
                        fVar195 = fVar109 * fStack_2b14;
                        fVar196 = fVar110 * fStack_2b10;
                        fVar197 = fVar111 * fStack_2b0c;
                        fVar198 = fVar112 * fStack_2b08;
                        fVar199 = fVar74 * (float)local_2c80;
                        fVar201 = fVar87 * local_2c80._4_4_;
                        fVar202 = fVar89 * fStack_2c78;
                        fVar203 = fVar91 * fStack_2c74;
                        fVar204 = fVar71 * fStack_2c70;
                        fVar205 = fVar72 * fStack_2c6c;
                        fVar206 = fVar73 * fStack_2c68;
                        fVar207 = fVar74 * local_2c60[0];
                        fVar209 = fVar87 * local_2c60[1];
                        fVar210 = fVar89 * local_2c60[2];
                        fVar211 = fVar91 * local_2c60[3];
                        fVar212 = fVar71 * fStack_2c50;
                        fVar213 = fVar72 * fStack_2c4c;
                        fVar214 = fVar73 * fStack_2c48;
                        if (local_2d08 != (RayK<8> *)0x0) {
                          lVar4 = *(long *)(lVar4 + 0xe0);
                          uVar57 = (ulong)*(uint *)(lVar55 + 0x20 + uVar53 * 4);
                          pRVar60 = local_2d08;
                          uVar59 = local_2cd0;
                          do {
                            auVar96 = *(undefined1 (*) [16])
                                       (*(long *)(lVar4 + (long)*(int *)(local_2cc0 + uVar59 * 4) *
                                                          0x38) + uVar57 * 4);
                            auVar66 = *(undefined1 (*) [16])
                                       (*(long *)(lVar4 + 0x38 +
                                                 (long)*(int *)(local_2cc0 + uVar59 * 4) * 0x38) +
                                       uVar57 * 4);
                            *(int *)((long)&local_2b60 + uVar59 * 4) = auVar96._0_4_;
                            uVar64 = vextractps_avx(auVar96,1);
                            *(undefined4 *)((long)&local_2b40 + uVar59 * 4) = uVar64;
                            uVar64 = vextractps_avx(auVar96,2);
                            *(undefined4 *)(local_2b20 + uVar59 * 4) = uVar64;
                            *(int *)(local_2ca0 + uVar59 * 4) = auVar66._0_4_;
                            uVar64 = vextractps_avx(auVar66,1);
                            *(undefined4 *)((long)&local_2c80 + uVar59 * 4) = uVar64;
                            fVar3 = (float)vextractps_avx(auVar66,2);
                            local_2c60[uVar59] = fVar3;
                            pRVar60 = (RayK<8> *)((ulong)pRVar60 ^ 1L << (uVar59 & 0x3f));
                            uVar59 = 0;
                            for (pRVar8 = pRVar60; ((ulong)pRVar8 & 1) == 0;
                                pRVar8 = (RayK<8> *)((ulong)pRVar8 >> 1 | 0x8000000000000000)) {
                              uVar59 = uVar59 + 1;
                            }
                          } while (pRVar60 != (RayK<8> *)0x0);
                          auVar45._8_8_ = uStack_2b58;
                          auVar45._0_8_ = local_2b60;
                          auVar45._16_8_ = uStack_2b50;
                          auVar45._24_8_ = uStack_2b48;
                          auVar159 = auVar45._0_28_;
                          auVar44._8_8_ = local_2ca0._8_8_;
                          auVar44._0_8_ = local_2ca0._0_8_;
                          auVar44._16_8_ = local_2ca0._16_8_;
                          auVar44._24_8_ = local_2ca0._24_8_;
                          auVar215 = auVar44._0_28_;
                          uVar59 = local_2d18;
                        }
                        local_2d00._4_4_ = fVar107 * auVar119._4_4_ + fVar87 * auVar7._4_4_;
                        local_2d00._0_4_ = fVar95 * auVar119._0_4_ + fVar74 * auVar7._0_4_;
                        auStack_2cf8._0_4_ = fVar108 * auVar119._8_4_ + fVar89 * auVar7._8_4_;
                        auStack_2cf8._4_4_ = fVar109 * auVar119._12_4_ + fVar91 * auVar7._12_4_;
                        fStack_2cf0 = fVar110 * auVar119._16_4_ + fVar71 * auVar7._16_4_;
                        fStack_2cec = fVar111 * auVar119._20_4_ + fVar72 * auVar7._20_4_;
                        fStack_2ce8 = fVar112 * auVar119._24_4_ + fVar73 * auVar7._24_4_;
                        fStack_2ce4 = auVar119._28_4_ + auVar7._28_4_;
                        auVar218._0_4_ = fVar216 + fVar146;
                        auVar218._4_4_ = fVar219 + fVar153;
                        auVar218._8_4_ = fVar220 + fVar154;
                        auVar218._12_4_ = fVar221 + fVar155;
                        auVar218._16_4_ = fVar222 + fVar156;
                        auVar218._20_4_ = fVar223 + fVar157;
                        auVar218._24_4_ = fVar224 + fVar158;
                        auVar218._28_4_ = in_ZMM15._28_4_ + auVar152._28_4_;
                        auVar126._0_4_ = fVar129 + fVar88;
                        auVar126._4_4_ = fVar140 + fVar90;
                        auVar126._8_4_ = fVar141 + fVar92;
                        auVar126._12_4_ = fVar142 + fVar93;
                        auVar126._16_4_ = fVar143 + fVar94;
                        auVar126._20_4_ = fVar144 + fVar127;
                        auVar126._24_4_ = fVar145 + fVar128;
                        auVar126._28_4_ = auVar139._28_4_ + auVar86._28_4_;
                        auVar83._0_4_ = auVar168._0_4_ * fVar95 + auVar177._0_4_ * fVar74;
                        auVar83._4_4_ = auVar168._4_4_ * fVar107 + auVar177._4_4_ * fVar87;
                        auVar83._8_4_ = auVar168._8_4_ * fVar108 + auVar177._8_4_ * fVar89;
                        auVar83._12_4_ = auVar168._12_4_ * fVar109 + auVar177._12_4_ * fVar91;
                        auVar83._16_4_ = auVar168._16_4_ * fVar110 + auVar177._16_4_ * fVar71;
                        auVar83._20_4_ = auVar168._20_4_ * fVar111 + auVar177._20_4_ * fVar72;
                        auVar83._24_4_ = auVar168._24_4_ * fVar112 + auVar177._24_4_ * fVar73;
                        auVar83._28_4_ = auVar139._28_4_ + auVar152._28_4_;
                        auVar151._0_4_ = fVar182 + fVar199;
                        auVar151._4_4_ = fVar186 + fVar201;
                        auVar151._8_4_ = fVar187 + fVar202;
                        auVar151._12_4_ = fVar188 + fVar203;
                        auVar151._16_4_ = fVar189 + fVar204;
                        auVar151._20_4_ = fVar190 + fVar205;
                        auVar151._24_4_ = fVar191 + fVar206;
                        fVar88 = auVar185._28_4_;
                        auVar151._28_4_ = fVar88 + in_ZMM12._28_4_;
                        auVar120._0_4_ = fVar192 + fVar207;
                        auVar120._4_4_ = fVar193 + fVar209;
                        auVar120._8_4_ = fVar194 + fVar210;
                        auVar120._12_4_ = fVar195 + fVar211;
                        auVar120._16_4_ = fVar196 + fVar212;
                        auVar120._20_4_ = fVar197 + fVar213;
                        auVar120._24_4_ = fVar198 + fVar214;
                        auVar120._28_4_ = in_ZMM11._28_4_ + in_ZMM13._28_4_;
                        auVar172._0_4_ = fVar95 * auVar159._0_4_ + auVar215._0_4_ * fVar74;
                        auVar172._4_4_ = fVar107 * auVar159._4_4_ + auVar215._4_4_ * fVar87;
                        auVar172._8_4_ = fVar108 * auVar159._8_4_ + auVar215._8_4_ * fVar89;
                        auVar172._12_4_ = fVar109 * auVar159._12_4_ + auVar215._12_4_ * fVar91;
                        auVar172._16_4_ = fVar110 * auVar159._16_4_ + auVar215._16_4_ * fVar71;
                        auVar172._20_4_ = fVar111 * auVar159._20_4_ + auVar215._20_4_ * fVar72;
                        auVar172._24_4_ = fVar112 * auVar159._24_4_ + auVar215._24_4_ * fVar73;
                        auVar172._28_4_ = auVar168._28_4_ + fVar88;
                        auVar139 = ZEXT3264(CONCAT428(auVar177._28_4_ + fVar88,
                                                      CONCAT424(fVar112 * (float)uStack_2b28 +
                                                                fVar73 * fStack_2c68,
                                                                CONCAT420(fVar111 * uStack_2b30.
                                                                                    _4_4_ +
                                                                          fVar72 * fStack_2c6c,
                                                                          CONCAT416(fVar110 * (float
                                                  )uStack_2b30 + fVar71 * fStack_2c70,
                                                  CONCAT412(fVar109 * uStack_2b38._4_4_ +
                                                            fVar91 * fStack_2c74,
                                                            CONCAT48(fVar108 * (float)uStack_2b38 +
                                                                     fVar89 * fStack_2c78,
                                                                     CONCAT44(fVar107 * local_2b40.
                                                                                        _4_4_ +
                                                                              fVar87 * local_2c80.
                                                                                       _4_4_,
                                                                              fVar95 * (float)
                                                  local_2b40 + fVar74 * (float)local_2c80))))))));
                        auVar152 = ZEXT3264(CONCAT428(auVar81._28_4_ + auVar67._28_4_,
                                                      CONCAT424(fVar112 * fStack_2b08 +
                                                                fVar73 * fStack_2c48,
                                                                CONCAT420(fVar111 * fStack_2b0c +
                                                                          fVar72 * fStack_2c4c,
                                                                          CONCAT416(fVar110 * 
                                                  fStack_2b10 + fVar71 * fStack_2c50,
                                                  CONCAT412(fVar109 * fStack_2b14 +
                                                            fVar91 * local_2c60[3],
                                                            CONCAT48(fVar108 * fStack_2b18 +
                                                                     fVar89 * local_2c60[2],
                                                                     CONCAT44(fVar107 * (float)
                                                  local_2b20._4_4_ + fVar87 * local_2c60[1],
                                                  fVar95 * (float)local_2b20._0_4_ +
                                                  fVar74 * local_2c60[0]))))))));
                      }
                      local_2b70 = *(undefined8 *)(lVar55 + 0x30);
                      uStack_2b68 = *(undefined8 *)(lVar55 + 0x38);
                      local_2b80 = *(undefined8 *)(lVar55 + 0x40);
                      uStack_2b78 = *(undefined8 *)(lVar55 + 0x48);
                      auVar81 = *(undefined1 (*) [32])ray;
                      auVar97 = *(undefined1 (*) [32])(ray + 0x20);
                      auVar67 = *(undefined1 (*) [32])(ray + 0x40);
                      local_2660 = vsubps_avx(_local_2d00,auVar81);
                      local_2680 = vsubps_avx(auVar218,auVar97);
                      local_26a0 = vsubps_avx(auVar126,auVar67);
                      auVar113 = vsubps_avx(auVar83,auVar81);
                      auVar121 = vsubps_avx(auVar151,auVar97);
                      auVar82 = vsubps_avx(auVar120,auVar67);
                      auVar80 = vsubps_avx(auVar172,auVar81);
                      auVar97 = vsubps_avx(auVar139._0_32_,auVar97);
                      auVar67 = vsubps_avx(auVar152._0_32_,auVar67);
                      local_26c0 = vsubps_avx(auVar80,local_2660);
                      local_2700 = vsubps_avx(auVar97,local_2680);
                      local_26e0 = vsubps_avx(auVar67,local_26a0);
                      auVar116._0_4_ = auVar80._0_4_ + local_2660._0_4_;
                      auVar116._4_4_ = auVar80._4_4_ + local_2660._4_4_;
                      auVar116._8_4_ = auVar80._8_4_ + local_2660._8_4_;
                      auVar116._12_4_ = auVar80._12_4_ + local_2660._12_4_;
                      auVar116._16_4_ = auVar80._16_4_ + local_2660._16_4_;
                      auVar116._20_4_ = auVar80._20_4_ + local_2660._20_4_;
                      auVar116._24_4_ = auVar80._24_4_ + local_2660._24_4_;
                      auVar116._28_4_ = auVar80._28_4_ + local_2660._28_4_;
                      auVar149._0_4_ = auVar97._0_4_ + local_2680._0_4_;
                      auVar149._4_4_ = auVar97._4_4_ + local_2680._4_4_;
                      auVar149._8_4_ = auVar97._8_4_ + local_2680._8_4_;
                      auVar149._12_4_ = auVar97._12_4_ + local_2680._12_4_;
                      auVar149._16_4_ = auVar97._16_4_ + local_2680._16_4_;
                      auVar149._20_4_ = auVar97._20_4_ + local_2680._20_4_;
                      auVar149._24_4_ = auVar97._24_4_ + local_2680._24_4_;
                      fVar74 = local_2680._28_4_;
                      fVar129 = auVar97._28_4_;
                      auVar149._28_4_ = fVar129 + fVar74;
                      fVar153 = local_26a0._0_4_;
                      auVar170._0_4_ = fVar153 + auVar67._0_4_;
                      fVar154 = local_26a0._4_4_;
                      auVar170._4_4_ = fVar154 + auVar67._4_4_;
                      fVar155 = local_26a0._8_4_;
                      auVar170._8_4_ = fVar155 + auVar67._8_4_;
                      fVar156 = local_26a0._12_4_;
                      auVar170._12_4_ = fVar156 + auVar67._12_4_;
                      fVar157 = local_26a0._16_4_;
                      auVar170._16_4_ = fVar157 + auVar67._16_4_;
                      fVar158 = local_26a0._20_4_;
                      auVar170._20_4_ = fVar158 + auVar67._20_4_;
                      fVar216 = local_26a0._24_4_;
                      auVar170._24_4_ = fVar216 + auVar67._24_4_;
                      auVar170._28_4_ = local_26a0._28_4_ + auVar67._28_4_;
                      auVar181._0_4_ = local_26e0._0_4_ * auVar149._0_4_;
                      auVar181._4_4_ = local_26e0._4_4_ * auVar149._4_4_;
                      auVar181._8_4_ = local_26e0._8_4_ * auVar149._8_4_;
                      auVar181._12_4_ = local_26e0._12_4_ * auVar149._12_4_;
                      auVar181._16_4_ = local_26e0._16_4_ * auVar149._16_4_;
                      auVar181._20_4_ = local_26e0._20_4_ * auVar149._20_4_;
                      auVar181._28_36_ = auVar152._28_36_;
                      auVar181._24_4_ = local_26e0._24_4_ * auVar149._24_4_;
                      auVar66 = vfmsub231ps_fma(auVar181._0_32_,local_2700,auVar170);
                      auVar173._0_4_ = auVar170._0_4_ * local_26c0._0_4_;
                      auVar173._4_4_ = auVar170._4_4_ * local_26c0._4_4_;
                      auVar173._8_4_ = auVar170._8_4_ * local_26c0._8_4_;
                      auVar173._12_4_ = auVar170._12_4_ * local_26c0._12_4_;
                      auVar173._16_4_ = auVar170._16_4_ * local_26c0._16_4_;
                      auVar173._20_4_ = auVar170._20_4_ * local_26c0._20_4_;
                      auVar173._28_36_ = auVar139._28_36_;
                      auVar173._24_4_ = auVar170._24_4_ * local_26c0._24_4_;
                      auVar96 = vfmsub231ps_fma(auVar173._0_32_,local_26e0,auVar116);
                      auVar23._4_4_ = auVar116._4_4_ * local_2700._4_4_;
                      auVar23._0_4_ = auVar116._0_4_ * local_2700._0_4_;
                      auVar23._8_4_ = auVar116._8_4_ * local_2700._8_4_;
                      auVar23._12_4_ = auVar116._12_4_ * local_2700._12_4_;
                      auVar23._16_4_ = auVar116._16_4_ * local_2700._16_4_;
                      auVar23._20_4_ = auVar116._20_4_ * local_2700._20_4_;
                      auVar23._24_4_ = auVar116._24_4_ * local_2700._24_4_;
                      auVar23._28_4_ = auVar116._28_4_;
                      auVar9 = vfmsub231ps_fma(auVar23,local_26c0,auVar149);
                      pRVar60 = ray + 0xc0;
                      fVar88 = *(float *)pRVar60;
                      fVar90 = *(float *)(ray + 0xc4);
                      fVar92 = *(float *)(ray + 200);
                      fVar93 = *(float *)(ray + 0xcc);
                      fVar94 = *(float *)(ray + 0xd0);
                      fVar127 = *(float *)(ray + 0xd4);
                      fVar128 = *(float *)(ray + 0xd8);
                      auVar159 = *(undefined1 (*) [28])pRVar60;
                      auVar117._0_4_ = fVar88 * auVar9._0_4_;
                      auVar117._4_4_ = fVar90 * auVar9._4_4_;
                      auVar117._8_4_ = fVar92 * auVar9._8_4_;
                      auVar117._12_4_ = fVar93 * auVar9._12_4_;
                      auVar117._16_4_ = fVar94 * 0.0;
                      auVar117._20_4_ = fVar127 * 0.0;
                      auVar117._24_4_ = fVar128 * 0.0;
                      auVar117._28_4_ = 0;
                      auVar171 = *(undefined1 (*) [32])(ray + 0xa0);
                      local_2640 = auVar171;
                      auVar96 = vfmadd231ps_fma(auVar117,auVar171,ZEXT1632(auVar96));
                      auVar81 = *(undefined1 (*) [32])(ray + 0x80);
                      auVar185 = ZEXT3264(auVar81);
                      auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar81,ZEXT1632(auVar66));
                      local_2720 = vsubps_avx(local_2680,auVar121);
                      auVar174 = vsubps_avx(local_26a0,auVar82);
                      in_ZMM14 = ZEXT3264(auVar174);
                      auVar150._0_4_ = auVar121._0_4_ + local_2680._0_4_;
                      auVar150._4_4_ = auVar121._4_4_ + local_2680._4_4_;
                      auVar150._8_4_ = auVar121._8_4_ + local_2680._8_4_;
                      auVar150._12_4_ = auVar121._12_4_ + local_2680._12_4_;
                      auVar150._16_4_ = auVar121._16_4_ + local_2680._16_4_;
                      auVar150._20_4_ = auVar121._20_4_ + local_2680._20_4_;
                      auVar150._24_4_ = auVar121._24_4_ + local_2680._24_4_;
                      auVar150._28_4_ = auVar121._28_4_ + fVar74;
                      auVar217._0_4_ = fVar153 + auVar82._0_4_;
                      auVar217._4_4_ = fVar154 + auVar82._4_4_;
                      auVar217._8_4_ = fVar155 + auVar82._8_4_;
                      auVar217._12_4_ = fVar156 + auVar82._12_4_;
                      auVar217._16_4_ = fVar157 + auVar82._16_4_;
                      auVar217._20_4_ = fVar158 + auVar82._20_4_;
                      auVar217._24_4_ = fVar216 + auVar82._24_4_;
                      auVar217._28_4_ = local_26a0._28_4_ + auVar82._28_4_;
                      fVar140 = auVar174._0_4_;
                      fVar141 = auVar174._4_4_;
                      auVar24._4_4_ = fVar141 * auVar150._4_4_;
                      auVar24._0_4_ = fVar140 * auVar150._0_4_;
                      fVar142 = auVar174._8_4_;
                      auVar24._8_4_ = fVar142 * auVar150._8_4_;
                      fVar143 = auVar174._12_4_;
                      auVar24._12_4_ = fVar143 * auVar150._12_4_;
                      fVar144 = auVar174._16_4_;
                      auVar24._16_4_ = fVar144 * auVar150._16_4_;
                      fVar145 = auVar174._20_4_;
                      auVar24._20_4_ = fVar145 * auVar150._20_4_;
                      fVar146 = auVar174._24_4_;
                      auVar24._24_4_ = fVar146 * auVar150._24_4_;
                      auVar24._28_4_ = fVar74;
                      auVar9 = vfmsub231ps_fma(auVar24,local_2720,auVar217);
                      auVar175 = vsubps_avx(local_2660,auVar113);
                      in_ZMM13 = ZEXT3264(auVar175);
                      fVar74 = auVar175._0_4_;
                      fVar89 = auVar175._4_4_;
                      auVar25._4_4_ = auVar217._4_4_ * fVar89;
                      auVar25._0_4_ = auVar217._0_4_ * fVar74;
                      fVar71 = auVar175._8_4_;
                      auVar25._8_4_ = auVar217._8_4_ * fVar71;
                      fVar73 = auVar175._12_4_;
                      auVar25._12_4_ = auVar217._12_4_ * fVar73;
                      fVar107 = auVar175._16_4_;
                      auVar25._16_4_ = auVar217._16_4_ * fVar107;
                      fVar109 = auVar175._20_4_;
                      auVar25._20_4_ = auVar217._20_4_ * fVar109;
                      fVar111 = auVar175._24_4_;
                      auVar25._24_4_ = auVar217._24_4_ * fVar111;
                      auVar25._28_4_ = auVar217._28_4_;
                      auVar164._0_4_ = auVar113._0_4_ + local_2660._0_4_;
                      auVar164._4_4_ = auVar113._4_4_ + local_2660._4_4_;
                      auVar164._8_4_ = auVar113._8_4_ + local_2660._8_4_;
                      auVar164._12_4_ = auVar113._12_4_ + local_2660._12_4_;
                      auVar164._16_4_ = auVar113._16_4_ + local_2660._16_4_;
                      auVar164._20_4_ = auVar113._20_4_ + local_2660._20_4_;
                      auVar164._24_4_ = auVar113._24_4_ + local_2660._24_4_;
                      auVar164._28_4_ = auVar113._28_4_ + local_2660._28_4_;
                      auVar66 = vfmsub231ps_fma(auVar25,auVar174,auVar164);
                      fVar87 = local_2720._0_4_;
                      fVar91 = local_2720._4_4_;
                      auVar26._4_4_ = auVar164._4_4_ * fVar91;
                      auVar26._0_4_ = auVar164._0_4_ * fVar87;
                      fVar72 = local_2720._8_4_;
                      auVar26._8_4_ = auVar164._8_4_ * fVar72;
                      fVar95 = local_2720._12_4_;
                      auVar26._12_4_ = auVar164._12_4_ * fVar95;
                      fVar108 = local_2720._16_4_;
                      auVar26._16_4_ = auVar164._16_4_ * fVar108;
                      fVar110 = local_2720._20_4_;
                      auVar26._20_4_ = auVar164._20_4_ * fVar110;
                      fVar112 = local_2720._24_4_;
                      auVar26._24_4_ = auVar164._24_4_ * fVar112;
                      auVar26._28_4_ = auVar164._28_4_;
                      auVar130 = vfmsub231ps_fma(auVar26,auVar175,auVar150);
                      auVar27._4_4_ = fVar90 * auVar130._4_4_;
                      auVar27._0_4_ = fVar88 * auVar130._0_4_;
                      auVar27._8_4_ = fVar92 * auVar130._8_4_;
                      auVar27._12_4_ = fVar93 * auVar130._12_4_;
                      auVar27._16_4_ = fVar94 * 0.0;
                      auVar27._20_4_ = fVar127 * 0.0;
                      auVar27._24_4_ = fVar128 * 0.0;
                      auVar27._28_4_ = auVar150._28_4_;
                      auVar66 = vfmadd231ps_fma(auVar27,auVar171,ZEXT1632(auVar66));
                      auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar81,ZEXT1632(auVar9));
                      auVar152 = ZEXT1664(auVar66);
                      auVar183 = vsubps_avx(auVar113,auVar80);
                      in_ZMM15 = ZEXT3264(auVar183);
                      auVar79._0_4_ = auVar113._0_4_ + auVar80._0_4_;
                      auVar79._4_4_ = auVar113._4_4_ + auVar80._4_4_;
                      auVar79._8_4_ = auVar113._8_4_ + auVar80._8_4_;
                      auVar79._12_4_ = auVar113._12_4_ + auVar80._12_4_;
                      auVar79._16_4_ = auVar113._16_4_ + auVar80._16_4_;
                      auVar79._20_4_ = auVar113._20_4_ + auVar80._20_4_;
                      auVar79._24_4_ = auVar113._24_4_ + auVar80._24_4_;
                      auVar79._28_4_ = auVar113._28_4_ + auVar80._28_4_;
                      auVar80 = vsubps_avx(auVar121,auVar97);
                      in_ZMM12 = ZEXT3264(auVar80);
                      auVar69._0_4_ = auVar121._0_4_ + auVar97._0_4_;
                      auVar69._4_4_ = auVar121._4_4_ + auVar97._4_4_;
                      auVar69._8_4_ = auVar121._8_4_ + auVar97._8_4_;
                      auVar69._12_4_ = auVar121._12_4_ + auVar97._12_4_;
                      auVar69._16_4_ = auVar121._16_4_ + auVar97._16_4_;
                      auVar69._20_4_ = auVar121._20_4_ + auVar97._20_4_;
                      auVar69._24_4_ = auVar121._24_4_ + auVar97._24_4_;
                      auVar69._28_4_ = auVar121._28_4_ + fVar129;
                      auVar180 = vsubps_avx(auVar82,auVar67);
                      auVar100._0_4_ = auVar82._0_4_ + auVar67._0_4_;
                      auVar100._4_4_ = auVar82._4_4_ + auVar67._4_4_;
                      auVar100._8_4_ = auVar82._8_4_ + auVar67._8_4_;
                      auVar100._12_4_ = auVar82._12_4_ + auVar67._12_4_;
                      auVar100._16_4_ = auVar82._16_4_ + auVar67._16_4_;
                      auVar100._20_4_ = auVar82._20_4_ + auVar67._20_4_;
                      auVar100._24_4_ = auVar82._24_4_ + auVar67._24_4_;
                      auVar100._28_4_ = auVar82._28_4_ + auVar67._28_4_;
                      auVar28._4_4_ = auVar180._4_4_ * auVar69._4_4_;
                      auVar28._0_4_ = auVar180._0_4_ * auVar69._0_4_;
                      auVar28._8_4_ = auVar180._8_4_ * auVar69._8_4_;
                      auVar28._12_4_ = auVar180._12_4_ * auVar69._12_4_;
                      auVar28._16_4_ = auVar180._16_4_ * auVar69._16_4_;
                      auVar28._20_4_ = auVar180._20_4_ * auVar69._20_4_;
                      auVar28._24_4_ = auVar180._24_4_ * auVar69._24_4_;
                      auVar28._28_4_ = fVar129;
                      auVar130 = vfmsub231ps_fma(auVar28,auVar80,auVar100);
                      auVar29._4_4_ = auVar183._4_4_ * auVar100._4_4_;
                      auVar29._0_4_ = auVar183._0_4_ * auVar100._0_4_;
                      auVar29._8_4_ = auVar183._8_4_ * auVar100._8_4_;
                      auVar29._12_4_ = auVar183._12_4_ * auVar100._12_4_;
                      auVar29._16_4_ = auVar183._16_4_ * auVar100._16_4_;
                      auVar29._20_4_ = auVar183._20_4_ * auVar100._20_4_;
                      auVar29._24_4_ = auVar183._24_4_ * auVar100._24_4_;
                      auVar29._28_4_ = auVar100._28_4_;
                      auVar9 = vfmsub231ps_fma(auVar29,auVar180,auVar79);
                      auVar30._4_4_ = auVar80._4_4_ * auVar79._4_4_;
                      auVar30._0_4_ = auVar80._0_4_ * auVar79._0_4_;
                      auVar30._8_4_ = auVar80._8_4_ * auVar79._8_4_;
                      auVar30._12_4_ = auVar80._12_4_ * auVar79._12_4_;
                      auVar30._16_4_ = auVar80._16_4_ * auVar79._16_4_;
                      auVar30._20_4_ = auVar80._20_4_ * auVar79._20_4_;
                      auVar30._24_4_ = auVar80._24_4_ * auVar79._24_4_;
                      auVar30._28_4_ = auVar79._28_4_;
                      auVar10 = vfmsub231ps_fma(auVar30,auVar183,auVar69);
                      auVar31._4_4_ = fVar90 * auVar10._4_4_;
                      auVar31._0_4_ = fVar88 * auVar10._0_4_;
                      auVar31._8_4_ = fVar92 * auVar10._8_4_;
                      auVar31._12_4_ = fVar93 * auVar10._12_4_;
                      auVar31._16_4_ = fVar94 * 0.0;
                      auVar31._20_4_ = fVar127 * 0.0;
                      auVar31._24_4_ = fVar128 * 0.0;
                      auVar31._28_4_ = auVar69._28_4_;
                      auVar9 = vfmadd231ps_fma(auVar31,auVar171,ZEXT1632(auVar9));
                      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar81,ZEXT1632(auVar130));
                      auVar130._0_8_ =
                           CONCAT44(auVar9._4_4_ + auVar96._4_4_ + auVar66._4_4_,
                                    auVar9._0_4_ + auVar96._0_4_ + auVar66._0_4_);
                      auVar130._8_4_ = auVar9._8_4_ + auVar96._8_4_ + auVar66._8_4_;
                      auVar130._12_4_ = auVar9._12_4_ + auVar96._12_4_ + auVar66._12_4_;
                      auVar75 = ZEXT1632(auVar130);
                      auVar97 = vandps_avx(auVar75,local_2ba0);
                      uVar57 = CONCAT44(auVar97._4_4_ * 1.1920929e-07,auVar97._0_4_ * 1.1920929e-07)
                      ;
                      fVar88 = auVar97._8_4_ * 1.1920929e-07;
                      auVar32._8_4_ = fVar88;
                      auVar32._0_8_ = uVar57;
                      fVar90 = auVar97._12_4_ * 1.1920929e-07;
                      auVar32._12_4_ = fVar90;
                      fVar92 = auVar97._16_4_ * 1.1920929e-07;
                      auVar32._16_4_ = fVar92;
                      fVar93 = auVar97._20_4_ * 1.1920929e-07;
                      auVar32._20_4_ = fVar93;
                      fVar94 = auVar97._24_4_ * 1.1920929e-07;
                      auVar32._24_4_ = fVar94;
                      auVar32._28_4_ = auVar97._28_4_;
                      auVar118 = ZEXT1632(auVar96);
                      auVar67 = vminps_avx(auVar118,ZEXT1632(auVar66));
                      auVar67 = vminps_avx(auVar67,ZEXT1632(auVar9));
                      local_2c40._8_4_ = 0x80000000;
                      local_2c40._0_8_ = 0x8000000080000000;
                      local_2c40._12_4_ = 0x80000000;
                      local_2c40._16_4_ = 0x80000000;
                      local_2c40._20_4_ = 0x80000000;
                      local_2c40._24_4_ = 0x80000000;
                      local_2c40._28_4_ = 0x80000000;
                      auVar124._0_8_ = uVar57 ^ 0x8000000080000000;
                      auVar124._8_4_ = -fVar88;
                      auVar124._12_4_ = -fVar90;
                      auVar124._16_4_ = -fVar92;
                      auVar124._20_4_ = -fVar93;
                      auVar124._24_4_ = -fVar94;
                      auVar124._28_4_ = auVar97._28_4_ ^ 0x80000000;
                      auVar67 = vcmpps_avx(auVar67,auVar124,5);
                      auVar113 = vmaxps_avx(auVar118,ZEXT1632(auVar66));
                      auVar97 = vmaxps_avx(auVar113,ZEXT1632(auVar9));
                      auVar97 = vcmpps_avx(auVar97,auVar32,2);
                      auVar121 = vorps_avx(auVar67,auVar97);
                      auVar105 = local_2c20 & auVar121;
                      auVar97 = vandps_avx(auVar121,local_2c20);
                      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar105 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar105 >> 0x7f,0) != '\0') ||
                            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar105 >> 0xbf,0) != '\0') ||
                          (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar105[0x1f] < '\0') {
                        local_2780 = auVar75;
                        auVar105 = local_2780;
                        local_2740 = auVar97;
                        auVar33._4_4_ = fVar91 * local_26e0._4_4_;
                        auVar33._0_4_ = fVar87 * local_26e0._0_4_;
                        auVar33._8_4_ = fVar72 * local_26e0._8_4_;
                        auVar33._12_4_ = fVar95 * local_26e0._12_4_;
                        auVar33._16_4_ = fVar108 * local_26e0._16_4_;
                        auVar33._20_4_ = fVar110 * local_26e0._20_4_;
                        auVar33._24_4_ = fVar112 * local_26e0._24_4_;
                        auVar33._28_4_ = auVar121._28_4_;
                        local_2760 = fVar74 * local_2700._0_4_;
                        fStack_275c = fVar89 * local_2700._4_4_;
                        fStack_2758 = fVar71 * local_2700._8_4_;
                        fStack_2754 = fVar73 * local_2700._12_4_;
                        fStack_2750 = fVar107 * local_2700._16_4_;
                        fStack_274c = fVar109 * local_2700._20_4_;
                        uStack_2744 = auVar67._28_4_;
                        fStack_2748 = fVar111 * local_2700._24_4_;
                        auVar96 = vfmsub213ps_fma(local_2700,auVar174,auVar33);
                        auVar34._4_4_ = auVar80._4_4_ * fVar141;
                        auVar34._0_4_ = auVar80._0_4_ * fVar140;
                        auVar34._8_4_ = auVar80._8_4_ * fVar142;
                        auVar34._12_4_ = auVar80._12_4_ * fVar143;
                        auVar34._16_4_ = auVar80._16_4_ * fVar144;
                        auVar34._20_4_ = auVar80._20_4_ * fVar145;
                        auVar34._24_4_ = auVar80._24_4_ * fVar146;
                        auVar34._28_4_ = uStack_2744;
                        auVar35._4_4_ = fVar89 * auVar180._4_4_;
                        auVar35._0_4_ = fVar74 * auVar180._0_4_;
                        auVar35._8_4_ = fVar71 * auVar180._8_4_;
                        auVar35._12_4_ = fVar73 * auVar180._12_4_;
                        auVar35._16_4_ = fVar107 * auVar180._16_4_;
                        auVar35._20_4_ = fVar109 * auVar180._20_4_;
                        auVar35._24_4_ = fVar111 * auVar180._24_4_;
                        auVar35._28_4_ = auVar113._28_4_;
                        auVar9 = vfmsub213ps_fma(auVar180,local_2720,auVar34);
                        auVar67 = vandps_avx(auVar33,local_2ba0);
                        auVar82 = vandps_avx(auVar34,local_2ba0);
                        auVar67 = vcmpps_avx(auVar67,auVar82,1);
                        auVar121 = vblendvps_avx(ZEXT1632(auVar9),ZEXT1632(auVar96),auVar67);
                        auVar138._0_4_ = auVar183._0_4_ * fVar87;
                        auVar138._4_4_ = auVar183._4_4_ * fVar91;
                        auVar138._8_4_ = auVar183._8_4_ * fVar72;
                        auVar138._12_4_ = auVar183._12_4_ * fVar95;
                        auVar138._16_4_ = auVar183._16_4_ * fVar108;
                        auVar138._20_4_ = auVar183._20_4_ * fVar110;
                        auVar138._24_4_ = auVar183._24_4_ * fVar112;
                        auVar138._28_4_ = 0;
                        auVar96 = vfmsub213ps_fma(auVar183,auVar174,auVar35);
                        in_ZMM15 = ZEXT1664(auVar96);
                        auVar36._4_4_ = local_26c0._4_4_ * fVar141;
                        auVar36._0_4_ = local_26c0._0_4_ * fVar140;
                        auVar36._8_4_ = local_26c0._8_4_ * fVar142;
                        auVar36._12_4_ = local_26c0._12_4_ * fVar143;
                        auVar36._16_4_ = local_26c0._16_4_ * fVar144;
                        auVar36._20_4_ = local_26c0._20_4_ * fVar145;
                        auVar36._24_4_ = local_26c0._24_4_ * fVar146;
                        auVar36._28_4_ = auVar82._28_4_;
                        auVar9 = vfmsub213ps_fma(local_26e0,auVar175,auVar36);
                        auVar67 = vandps_avx(auVar36,local_2ba0);
                        auVar82 = vandps_avx(auVar35,local_2ba0);
                        auVar67 = vcmpps_avx(auVar67,auVar82,1);
                        auVar67 = vblendvps_avx(ZEXT1632(auVar96),ZEXT1632(auVar9),auVar67);
                        auVar50._4_4_ = fStack_275c;
                        auVar50._0_4_ = local_2760;
                        auVar50._8_4_ = fStack_2758;
                        auVar50._12_4_ = fStack_2754;
                        auVar50._16_4_ = fStack_2750;
                        auVar50._20_4_ = fStack_274c;
                        auVar50._24_4_ = fStack_2748;
                        auVar50._28_4_ = uStack_2744;
                        auVar96 = vfmsub213ps_fma(local_26c0,local_2720,auVar50);
                        auVar9 = vfmsub213ps_fma(auVar80,auVar175,auVar138);
                        in_ZMM12 = ZEXT1664(auVar9);
                        auVar82 = vandps_avx(auVar50,local_2ba0);
                        auVar113 = vandps_avx(auVar138,local_2ba0);
                        auVar82 = vcmpps_avx(auVar82,auVar113,1);
                        auVar113 = vblendvps_avx(ZEXT1632(auVar9),ZEXT1632(auVar96),auVar82);
                        local_2d00._0_4_ = auVar159._0_4_;
                        local_2d00._4_4_ = auVar159._4_4_;
                        auStack_2cf8._0_4_ = auVar159._8_4_;
                        auStack_2cf8._4_4_ = auVar159._12_4_;
                        fStack_2cf0 = auVar159._16_4_;
                        fStack_2cec = auVar159._20_4_;
                        fStack_2ce8 = auVar159._24_4_;
                        auVar37._4_4_ = auVar113._4_4_ * (float)local_2d00._4_4_;
                        auVar37._0_4_ = auVar113._0_4_ * (float)local_2d00._0_4_;
                        auVar37._8_4_ = auVar113._8_4_ * (float)auStack_2cf8._0_4_;
                        auVar37._12_4_ = auVar113._12_4_ * (float)auStack_2cf8._4_4_;
                        auVar37._16_4_ = auVar113._16_4_ * fStack_2cf0;
                        auVar37._20_4_ = auVar113._20_4_ * fStack_2cec;
                        auVar37._24_4_ = auVar113._24_4_ * fStack_2ce8;
                        auVar37._28_4_ = auVar82._28_4_;
                        auVar96 = vfmadd213ps_fma(auVar171,auVar67,auVar37);
                        auVar96 = vfmadd213ps_fma(auVar81,auVar121,ZEXT1632(auVar96));
                        auVar185 = ZEXT1664(auVar96);
                        fVar74 = auVar96._0_4_ + auVar96._0_4_;
                        fVar87 = auVar96._4_4_ + auVar96._4_4_;
                        fVar89 = auVar96._8_4_ + auVar96._8_4_;
                        fVar91 = auVar96._12_4_ + auVar96._12_4_;
                        auVar80 = ZEXT1632(CONCAT412(fVar91,CONCAT48(fVar89,CONCAT44(fVar87,fVar74))
                                                    ));
                        auVar38._4_4_ = auVar113._4_4_ * fVar154;
                        auVar38._0_4_ = auVar113._0_4_ * fVar153;
                        auVar38._8_4_ = auVar113._8_4_ * fVar155;
                        auVar38._12_4_ = auVar113._12_4_ * fVar156;
                        auVar38._16_4_ = auVar113._16_4_ * fVar157;
                        auVar38._20_4_ = auVar113._20_4_ * fVar158;
                        auVar38._24_4_ = auVar113._24_4_ * fVar216;
                        auVar38._28_4_ = 0;
                        auVar96 = vfmadd213ps_fma(local_2680,auVar67,auVar38);
                        auVar9 = vfmadd213ps_fma(local_2660,auVar121,ZEXT1632(auVar96));
                        auVar81 = vrcpps_avx(auVar80);
                        auVar180._8_4_ = 0x3f800000;
                        auVar180._0_8_ = 0x3f8000003f800000;
                        auVar180._12_4_ = 0x3f800000;
                        auVar180._16_4_ = 0x3f800000;
                        auVar180._20_4_ = 0x3f800000;
                        auVar180._24_4_ = 0x3f800000;
                        auVar180._28_4_ = 0x3f800000;
                        auVar96 = vfnmadd213ps_fma(auVar81,auVar80,auVar180);
                        auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar81,auVar81);
                        auVar75 = ZEXT1632(CONCAT412(auVar96._12_4_ *
                                                     (auVar9._12_4_ + auVar9._12_4_),
                                                     CONCAT48(auVar96._8_4_ *
                                                              (auVar9._8_4_ + auVar9._8_4_),
                                                              CONCAT44(auVar96._4_4_ *
                                                                       (auVar9._4_4_ + auVar9._4_4_)
                                                                       ,auVar96._0_4_ *
                                                                        (auVar9._0_4_ + auVar9._0_4_
                                                                        )))));
                        auVar81 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar75,2);
                        auVar82 = vcmpps_avx(auVar75,*(undefined1 (*) [32])(ray + 0x100),2);
                        auVar81 = vandps_avx(auVar82,auVar81);
                        auVar171._0_8_ = CONCAT44(fVar87,fVar74) ^ 0x8000000080000000;
                        auVar171._8_4_ = -fVar89;
                        auVar171._12_4_ = -fVar91;
                        auVar171._16_4_ = 0x80000000;
                        auVar171._20_4_ = 0x80000000;
                        auVar171._24_4_ = 0x80000000;
                        auVar171._28_4_ = 0x80000000;
                        auVar82 = vcmpps_avx(auVar171,auVar80,4);
                        auVar81 = vandps_avx(auVar82,auVar81);
                        auVar81 = vpslld_avx2(auVar81,0x1f);
                        auVar82 = vpsrad_avx2(auVar81,0x1f);
                        auVar81 = auVar97 & auVar82;
                        auVar97 = vandps_avx(auVar82,auVar97);
                        auVar82 = local_2720;
                        local_2780 = auVar105;
                        if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar81 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar81 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar81 >> 0x7f,0) != '\0') ||
                              (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar81 >> 0xbf,0) != '\0') ||
                            (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar81[0x1f] < '\0') {
                          _local_27a0 = auVar118;
                          _local_27c0 = ZEXT1632(auVar66);
                          local_2780._8_8_ = auVar130._8_8_;
                          local_27e0 = auVar130._0_8_;
                          uStack_27d8 = local_2780._8_8_;
                          uStack_27d0 = 0;
                          uStack_27c8 = 0;
                          local_2800 = auVar75;
                          local_2820 = auVar121;
                          local_2840 = auVar67;
                          local_2860 = auVar113;
                        }
                      }
                      in_ZMM11 = ZEXT3264(auVar82);
                      auVar181 = ZEXT3264(auVar180);
                      auVar173 = ZEXT3264(auVar171);
                      auVar165 = ZEXT3264(local_2ba0);
                      auVar139 = ZEXT3264(auVar75);
                      auVar106 = ZEXT3264(auVar67);
                      uVar63 = *(uint *)((long)&local_2b70 + uVar53 * 4);
                      unaff_R15 = *(ulong *)(pRVar54 + (ulong)uVar63 * 8);
                      uVar64 = *(undefined4 *)(unaff_R15 + 0x34);
                      auVar70._4_4_ = uVar64;
                      auVar70._0_4_ = uVar64;
                      auVar70._8_4_ = uVar64;
                      auVar70._12_4_ = uVar64;
                      auVar70._16_4_ = uVar64;
                      auVar70._20_4_ = uVar64;
                      auVar70._24_4_ = uVar64;
                      auVar70._28_4_ = uVar64;
                      auVar81 = vpand_avx2(auVar70,*(undefined1 (*) [32])(ray + 0x120));
                      auVar67 = vpcmpeqd_avx2(auVar81,_DAT_01faff00);
                      auVar81 = auVar97 & ~auVar67;
                      if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar81 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar81 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar81 >> 0x7f,0) == '\0') &&
                            (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar81 >> 0xbf,0) == '\0') &&
                          (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar81[0x1f]) {
                        auVar86 = ZEXT3264(local_2bc0);
                        auVar119 = local_2c20;
                      }
                      else {
                        uVar64 = *(undefined4 *)((long)&local_2b80 + uVar53 * 4);
                        auVar81 = vandnps_avx(auVar67,auVar97);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (*(long *)(unaff_R15 + 0x48) == 0)) {
                          auVar86 = ZEXT3264(local_2bc0);
                          pRVar54 = (RayK<8> *)0x0;
                          local_2d00 = (undefined1  [8])uVar53;
                        }
                        else {
                          _auStack_2cf8 = SUB3224(*(undefined1 (*) [32])pRVar60,8);
                          local_2d00 = (undefined1  [8])uVar53;
                          auVar49._8_8_ = uStack_27d8;
                          auVar49._0_8_ = local_27e0;
                          auVar49._16_8_ = uStack_27d0;
                          auVar49._24_8_ = uStack_27c8;
                          auVar97 = vandps_avx(auVar49,local_2ba0);
                          auVar67 = vrcpps_avx(auVar49);
                          auVar125._8_4_ = 0x3f800000;
                          auVar125._0_8_ = 0x3f8000003f800000;
                          auVar125._12_4_ = 0x3f800000;
                          auVar125._16_4_ = 0x3f800000;
                          auVar125._20_4_ = 0x3f800000;
                          auVar125._24_4_ = 0x3f800000;
                          auVar125._28_4_ = 0x3f800000;
                          auVar96 = vfnmadd213ps_fma(auVar67,auVar49,auVar125);
                          auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar67,auVar67);
                          auVar101._8_4_ = 0x219392ef;
                          auVar101._0_8_ = 0x219392ef219392ef;
                          auVar101._12_4_ = 0x219392ef;
                          auVar101._16_4_ = 0x219392ef;
                          auVar101._20_4_ = 0x219392ef;
                          auVar101._24_4_ = 0x219392ef;
                          auVar101._28_4_ = 0x219392ef;
                          auVar97 = vcmpps_avx(auVar97,auVar101,5);
                          auVar97 = vandps_avx(auVar97,ZEXT1632(auVar96));
                          auVar39._4_4_ = auVar97._4_4_ * (float)local_27a0._4_4_;
                          auVar39._0_4_ = auVar97._0_4_ * (float)local_27a0._0_4_;
                          auVar39._8_4_ = auVar97._8_4_ * fStack_2798;
                          auVar39._12_4_ = auVar97._12_4_ * fStack_2794;
                          auVar39._16_4_ = auVar97._16_4_ * fStack_2790;
                          auVar39._20_4_ = auVar97._20_4_ * fStack_278c;
                          auVar39._24_4_ = auVar97._24_4_ * fStack_2788;
                          auVar39._28_4_ = 0x219392ef;
                          auVar67 = vminps_avx(auVar39,auVar125);
                          auVar40._4_4_ = auVar97._4_4_ * (float)local_27c0._4_4_;
                          auVar40._0_4_ = auVar97._0_4_ * (float)local_27c0._0_4_;
                          auVar40._8_4_ = auVar97._8_4_ * fStack_27b8;
                          auVar40._12_4_ = auVar97._12_4_ * fStack_27b4;
                          auVar40._16_4_ = auVar97._16_4_ * fStack_27b0;
                          auVar40._20_4_ = auVar97._20_4_ * fStack_27ac;
                          auVar40._24_4_ = auVar97._24_4_ * fStack_27a8;
                          auVar40._28_4_ = auVar97._28_4_;
                          local_2ae0 = vminps_avx(auVar40,auVar125);
                          local_2b60 = local_2820._0_8_;
                          uStack_2b58 = local_2820._8_8_;
                          uStack_2b50 = local_2820._16_8_;
                          uStack_2b48 = local_2820._24_8_;
                          local_2b40 = local_2840._0_8_;
                          uStack_2b38 = local_2840._8_8_;
                          uStack_2b30 = local_2840._16_8_;
                          uStack_2b28 = local_2840._24_8_;
                          auVar139 = ZEXT3264(local_2860);
                          _local_2b20 = local_2860;
                          local_2b00 = auVar67;
                          local_2ac0 = uVar64;
                          uStack_2abc = uVar64;
                          uStack_2ab8 = uVar64;
                          uStack_2ab4 = uVar64;
                          uStack_2ab0 = uVar64;
                          uStack_2aac = uVar64;
                          uStack_2aa8 = uVar64;
                          uStack_2aa4 = uVar64;
                          local_2aa0 = uVar63;
                          uStack_2a9c = uVar63;
                          uStack_2a98 = uVar63;
                          uStack_2a94 = uVar63;
                          uStack_2a90 = uVar63;
                          uStack_2a8c = uVar63;
                          uStack_2a88 = uVar63;
                          uStack_2a84 = uVar63;
                          vpcmpeqd_avx2(local_2ae0,local_2ae0);
                          local_2a80._4_4_ = context->user->instID[0];
                          local_2a80._0_4_ = local_2a80._4_4_;
                          local_2a80._8_4_ = local_2a80._4_4_;
                          local_2a80._12_4_ = local_2a80._4_4_;
                          local_2a80._16_4_ = local_2a80._4_4_;
                          local_2a80._20_4_ = local_2a80._4_4_;
                          local_2a80._24_4_ = local_2a80._4_4_;
                          local_2a80._28_4_ = local_2a80._4_4_;
                          local_2a60._4_4_ = context->user->instPrimID[0];
                          local_2a60._0_4_ = local_2a60._4_4_;
                          local_2a60._8_4_ = local_2a60._4_4_;
                          local_2a60._12_4_ = local_2a60._4_4_;
                          local_2a60._16_4_ = local_2a60._4_4_;
                          local_2a60._20_4_ = local_2a60._4_4_;
                          local_2a60._24_4_ = local_2a60._4_4_;
                          local_2a60._28_4_ = local_2a60._4_4_;
                          local_2c40 = *(undefined1 (*) [32])(ray + 0x100);
                          auVar97 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0x100),local_2800,
                                                  auVar81);
                          *(undefined1 (*) [32])(ray + 0x100) = auVar97;
                          local_2cc0 = auVar81;
                          local_2ca0._0_8_ = local_2cc0;
                          local_2ca0._8_8_ = *(void **)(unaff_R15 + 0x18);
                          local_2ca0._16_8_ = context->user;
                          local_2ca0._24_8_ = ray;
                          local_2c80 = (RTCHitN *)&local_2b60;
                          fStack_2c78 = 1.12104e-44;
                          if (*(code **)(unaff_R15 + 0x48) != (code *)0x0) {
                            auVar67 = ZEXT1632(auVar67._0_16_);
                            auVar139 = ZEXT1664(local_2860._0_16_);
                            auVar152 = ZEXT1664(auVar66);
                            auVar165 = ZEXT1664(local_2ba0._0_16_);
                            auVar173 = ZEXT1664(auVar171._0_16_);
                            auVar181 = ZEXT1664(auVar180._0_16_);
                            auVar185 = ZEXT1664(auVar185._0_16_);
                            in_ZMM11 = ZEXT1664(auVar82._0_16_);
                            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                            in_ZMM13 = ZEXT1664(auVar175._0_16_);
                            in_ZMM14 = ZEXT1664(auVar174._0_16_);
                            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                            (**(code **)(unaff_R15 + 0x48))(local_2ca0);
                            uVar59 = local_2d18;
                            context = local_2d10;
                          }
                          auVar86 = ZEXT3264(local_2bc0);
                          auVar81 = vpcmpeqd_avx2(local_2cc0,_DAT_01faff00);
                          auVar103 = vpcmpeqd_avx2(auVar67,auVar67);
                          auVar97 = auVar103 & ~auVar81;
                          if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar97 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar97 >> 0x7f,0) == '\0') &&
                                (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar97 >> 0xbf,0) == '\0') &&
                              (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                              -1 < auVar97[0x1f]) {
                            auVar81 = auVar81 ^ auVar103;
                          }
                          else {
                            p_Var6 = context->args->filter;
                            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                ((*(byte *)(unaff_R15 + 0x3e) & 0x40) != 0)))) {
                              auVar139 = ZEXT1664(auVar139._0_16_);
                              auVar152 = ZEXT1664(auVar152._0_16_);
                              auVar165 = ZEXT1664(auVar165._0_16_);
                              auVar173 = ZEXT1664(auVar173._0_16_);
                              auVar181 = ZEXT1664(auVar181._0_16_);
                              auVar185 = ZEXT1664(auVar185._0_16_);
                              in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                              in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                              in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                              in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                              (*p_Var6)((RTCFilterFunctionNArguments *)local_2ca0);
                              auVar86 = ZEXT3264(local_2bc0);
                              uVar59 = local_2d18;
                              context = local_2d10;
                            }
                            auVar97 = vpcmpeqd_avx2(local_2cc0,_DAT_01faff00);
                            auVar81 = auVar97 ^ _DAT_01fe9960;
                            auVar103._8_4_ = 0xff800000;
                            auVar103._0_8_ = 0xff800000ff800000;
                            auVar103._12_4_ = 0xff800000;
                            auVar103._16_4_ = 0xff800000;
                            auVar103._20_4_ = 0xff800000;
                            auVar103._24_4_ = 0xff800000;
                            auVar103._28_4_ = 0xff800000;
                            auVar97 = vblendvps_avx(auVar103,*(undefined1 (*) [32])
                                                              (local_2ca0._24_8_ + 0x100),auVar97);
                            *(undefined1 (*) [32])(local_2ca0._24_8_ + 0x100) = auVar97;
                          }
                          auVar106 = ZEXT3264(auVar103);
                          auVar97 = vblendvps_avx(local_2c40,*(undefined1 (*) [32])local_2cc8,
                                                  auVar81);
                          *(undefined1 (*) [32])local_2cc8 = auVar97;
                          pRVar54 = local_2cc8;
                        }
                        auVar119 = vandnps_avx(auVar81,local_2c20);
                        uVar53 = (ulong)local_2d00;
                      }
                      auVar97 = auVar86._0_32_;
                      if (((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                && (auVar119 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                               (auVar119 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                              && SUB321(auVar119 >> 0x7f,0) == '\0') &&
                             (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            SUB321(auVar119 >> 0xbf,0) == '\0') &&
                           (auVar119 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           -1 < auVar119[0x1f]) ||
                         (unaff_R15 = uVar53 + 1, bVar65 = 2 < uVar53, uVar53 = unaff_R15, bVar65))
                      break;
                    }
                    auVar81 = vandps_avx(auVar119,auVar97);
                    auVar97 = auVar97 & auVar119;
                  } while (((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar97 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar97 >> 0x7f,0) != '\0') ||
                              (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar97 >> 0xbf,0) != '\0') ||
                            (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar97[0x1f] < '\0') && (pRVar61 = pRVar61 + 1, pRVar61 < local_2bf0));
                  auVar97 = vpcmpeqd_avx2(auVar106._0_32_,auVar106._0_32_);
                  auVar84._0_4_ = auVar81._0_4_ ^ auVar97._0_4_;
                  auVar84._4_4_ = auVar81._4_4_ ^ auVar97._4_4_;
                  auVar84._8_4_ = auVar81._8_4_ ^ auVar97._8_4_;
                  auVar84._12_4_ = auVar81._12_4_ ^ auVar97._12_4_;
                  auVar84._16_4_ = auVar81._16_4_ ^ auVar97._16_4_;
                  auVar84._20_4_ = auVar81._20_4_ ^ auVar97._20_4_;
                  auVar84._24_4_ = auVar81._24_4_ ^ auVar97._24_4_;
                  auVar84._28_4_ = auVar81._28_4_ ^ auVar97._28_4_;
                }
                local_2be0 = vpor_avx2(local_2be0,auVar84);
                auVar97 = auVar97 & ~local_2be0;
                if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar97 >> 0x7f,0) == '\0') &&
                      (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar97 >> 0xbf,0) == '\0') &&
                    (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar97[0x1f]) goto LAB_019d2806;
                auVar104._8_4_ = 0xff800000;
                auVar104._0_8_ = 0xff800000ff800000;
                auVar104._12_4_ = 0xff800000;
                auVar104._16_4_ = 0xff800000;
                auVar104._20_4_ = 0xff800000;
                auVar104._24_4_ = 0xff800000;
                auVar104._28_4_ = 0xff800000;
                auVar81 = vblendvps_avx(local_28a0,auVar104,local_2be0);
                auVar97 = vpcmpeqd_avx2(local_28a0,local_28a0);
                auVar86 = ZEXT3264(auVar97);
                local_28a0 = auVar81;
              }
              goto LAB_019d172b;
            }
            uVar53 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            lVar55 = -0x10;
            auVar81 = vcmpps_avx(local_28a0,auVar81,6);
            auVar75._8_4_ = 0x7f800000;
            auVar75._0_8_ = 0x7f8000007f800000;
            auVar75._12_4_ = 0x7f800000;
            auVar75._16_4_ = 0x7f800000;
            auVar75._20_4_ = 0x7f800000;
            auVar75._24_4_ = 0x7f800000;
            auVar75._28_4_ = 0x7f800000;
            do {
              uVar57 = *(ulong *)(uVar53 + 0x20 + lVar55 * 2);
              if (uVar57 == 8) {
                auVar106 = ZEXT3264(auVar75);
                break;
              }
              uVar64 = *(undefined4 *)(uVar53 + 0x90 + lVar55);
              auVar114._4_4_ = uVar64;
              auVar114._0_4_ = uVar64;
              auVar114._8_4_ = uVar64;
              auVar114._12_4_ = uVar64;
              auVar114._16_4_ = uVar64;
              auVar114._20_4_ = uVar64;
              auVar114._24_4_ = uVar64;
              auVar114._28_4_ = uVar64;
              uVar64 = *(undefined4 *)(uVar53 + 0x30 + lVar55);
              auVar122._4_4_ = uVar64;
              auVar122._0_4_ = uVar64;
              auVar122._8_4_ = uVar64;
              auVar122._12_4_ = uVar64;
              auVar122._16_4_ = uVar64;
              auVar122._20_4_ = uVar64;
              auVar122._24_4_ = uVar64;
              auVar122._28_4_ = uVar64;
              auVar97 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar64 = *(undefined4 *)(uVar53 + 0xb0 + lVar55);
              auVar131._4_4_ = uVar64;
              auVar131._0_4_ = uVar64;
              auVar131._8_4_ = uVar64;
              auVar131._12_4_ = uVar64;
              auVar131._16_4_ = uVar64;
              auVar131._20_4_ = uVar64;
              auVar131._24_4_ = uVar64;
              auVar131._28_4_ = uVar64;
              auVar96 = vfmadd231ps_fma(auVar122,auVar97,auVar114);
              uVar64 = *(undefined4 *)(uVar53 + 0x50 + lVar55);
              auVar115._4_4_ = uVar64;
              auVar115._0_4_ = uVar64;
              auVar115._8_4_ = uVar64;
              auVar115._12_4_ = uVar64;
              auVar115._16_4_ = uVar64;
              auVar115._20_4_ = uVar64;
              auVar115._24_4_ = uVar64;
              auVar115._28_4_ = uVar64;
              auVar66 = vfmadd231ps_fma(auVar115,auVar97,auVar131);
              uVar64 = *(undefined4 *)(uVar53 + 0xd0 + lVar55);
              auVar132._4_4_ = uVar64;
              auVar132._0_4_ = uVar64;
              auVar132._8_4_ = uVar64;
              auVar132._12_4_ = uVar64;
              auVar132._16_4_ = uVar64;
              auVar132._20_4_ = uVar64;
              auVar132._24_4_ = uVar64;
              auVar132._28_4_ = uVar64;
              uVar64 = *(undefined4 *)(uVar53 + 0x70 + lVar55);
              auVar147._4_4_ = uVar64;
              auVar147._0_4_ = uVar64;
              auVar147._8_4_ = uVar64;
              auVar147._12_4_ = uVar64;
              auVar147._16_4_ = uVar64;
              auVar147._20_4_ = uVar64;
              auVar147._24_4_ = uVar64;
              auVar147._28_4_ = uVar64;
              uVar64 = *(undefined4 *)(uVar53 + 0xa0 + lVar55);
              auVar160._4_4_ = uVar64;
              auVar160._0_4_ = uVar64;
              auVar160._8_4_ = uVar64;
              auVar160._12_4_ = uVar64;
              auVar160._16_4_ = uVar64;
              auVar160._20_4_ = uVar64;
              auVar160._24_4_ = uVar64;
              auVar160._28_4_ = uVar64;
              uVar64 = *(undefined4 *)(uVar53 + 0x40 + lVar55);
              auVar166._4_4_ = uVar64;
              auVar166._0_4_ = uVar64;
              auVar166._8_4_ = uVar64;
              auVar166._12_4_ = uVar64;
              auVar166._16_4_ = uVar64;
              auVar166._20_4_ = uVar64;
              auVar166._24_4_ = uVar64;
              auVar166._28_4_ = uVar64;
              auVar9 = vfmadd231ps_fma(auVar147,auVar97,auVar132);
              auVar130 = vfmadd231ps_fma(auVar166,auVar97,auVar160);
              uVar64 = *(undefined4 *)(uVar53 + 0xc0 + lVar55);
              auVar133._4_4_ = uVar64;
              auVar133._0_4_ = uVar64;
              auVar133._8_4_ = uVar64;
              auVar133._12_4_ = uVar64;
              auVar133._16_4_ = uVar64;
              auVar133._20_4_ = uVar64;
              auVar133._24_4_ = uVar64;
              auVar133._28_4_ = uVar64;
              uVar64 = *(undefined4 *)(uVar53 + 0x60 + lVar55);
              auVar161._4_4_ = uVar64;
              auVar161._0_4_ = uVar64;
              auVar161._8_4_ = uVar64;
              auVar161._12_4_ = uVar64;
              auVar161._16_4_ = uVar64;
              auVar161._20_4_ = uVar64;
              auVar161._24_4_ = uVar64;
              auVar161._28_4_ = uVar64;
              uVar64 = *(undefined4 *)(uVar53 + 0xe0 + lVar55);
              auVar176._4_4_ = uVar64;
              auVar176._0_4_ = uVar64;
              auVar176._8_4_ = uVar64;
              auVar176._12_4_ = uVar64;
              auVar176._16_4_ = uVar64;
              auVar176._20_4_ = uVar64;
              auVar176._24_4_ = uVar64;
              auVar176._28_4_ = uVar64;
              auVar10 = vfmadd231ps_fma(auVar161,auVar97,auVar133);
              uVar64 = *(undefined4 *)(uVar53 + 0x80 + lVar55);
              auVar134._4_4_ = uVar64;
              auVar134._0_4_ = uVar64;
              auVar134._8_4_ = uVar64;
              auVar134._12_4_ = uVar64;
              auVar134._16_4_ = uVar64;
              auVar134._20_4_ = uVar64;
              auVar134._24_4_ = uVar64;
              auVar134._28_4_ = uVar64;
              auVar11 = vfmadd231ps_fma(auVar134,auVar97,auVar176);
              auVar46._8_8_ = local_2a40._8_8_;
              auVar46._0_8_ = local_2a40._0_8_;
              auVar46._16_8_ = local_2a40._16_8_;
              auVar46._24_8_ = local_2a40._24_8_;
              auVar181 = ZEXT3264(auVar46);
              auVar47._8_8_ = local_2a40._40_8_;
              auVar47._0_8_ = local_2a40._32_8_;
              auVar47._16_8_ = local_2a40._48_8_;
              auVar47._24_8_ = local_2a40._56_8_;
              auVar185 = ZEXT3264(auVar47);
              auVar48._8_8_ = local_2a40._72_8_;
              auVar48._0_8_ = local_2a40._64_8_;
              auVar48._16_8_ = local_2a40._80_8_;
              auVar48._24_8_ = local_2a40._88_8_;
              in_ZMM11 = ZEXT3264(auVar48);
              in_ZMM12 = ZEXT3264(local_2980);
              auVar67 = vsubps_avx(ZEXT1632(auVar96),auVar46);
              auVar12._4_4_ = local_2980._4_4_ * auVar67._4_4_;
              auVar12._0_4_ = local_2980._0_4_ * auVar67._0_4_;
              auVar12._8_4_ = local_2980._8_4_ * auVar67._8_4_;
              auVar12._12_4_ = local_2980._12_4_ * auVar67._12_4_;
              auVar12._16_4_ = local_2980._16_4_ * auVar67._16_4_;
              auVar12._20_4_ = local_2980._20_4_ * auVar67._20_4_;
              auVar12._24_4_ = local_2980._24_4_ * auVar67._24_4_;
              auVar12._28_4_ = auVar67._28_4_;
              auVar67 = vsubps_avx(ZEXT1632(auVar66),auVar47);
              in_ZMM13 = ZEXT3264(local_2960);
              auVar139._0_4_ = local_2960._0_4_ * auVar67._0_4_;
              auVar139._4_4_ = local_2960._4_4_ * auVar67._4_4_;
              auVar139._8_4_ = local_2960._8_4_ * auVar67._8_4_;
              auVar139._12_4_ = local_2960._12_4_ * auVar67._12_4_;
              auVar139._16_4_ = local_2960._16_4_ * auVar67._16_4_;
              auVar139._20_4_ = local_2960._20_4_ * auVar67._20_4_;
              auVar139._28_36_ = in_ZMM14._28_36_;
              auVar139._24_4_ = local_2960._24_4_ * auVar67._24_4_;
              auVar113 = auVar139._0_32_;
              in_ZMM14 = ZEXT3264(auVar113);
              auVar67 = vsubps_avx(ZEXT1632(auVar9),auVar48);
              auVar152._0_4_ = auVar67._0_4_ * (float)local_2940._0_4_;
              auVar152._4_4_ = auVar67._4_4_ * (float)local_2940._4_4_;
              auVar152._8_4_ = auVar67._8_4_ * fStack_2938;
              auVar152._12_4_ = auVar67._12_4_ * fStack_2934;
              auVar152._16_4_ = auVar67._16_4_ * fStack_2930;
              auVar152._20_4_ = auVar67._20_4_ * fStack_292c;
              auVar152._28_36_ = in_ZMM15._28_36_;
              auVar152._24_4_ = auVar67._24_4_ * fStack_2928;
              auVar121 = auVar152._0_32_;
              in_ZMM15 = ZEXT3264(auVar121);
              auVar67 = vsubps_avx(ZEXT1632(auVar130),auVar46);
              auVar167._0_4_ = local_2980._0_4_ * auVar67._0_4_;
              auVar167._4_4_ = local_2980._4_4_ * auVar67._4_4_;
              auVar167._8_4_ = local_2980._8_4_ * auVar67._8_4_;
              auVar167._12_4_ = local_2980._12_4_ * auVar67._12_4_;
              auVar167._16_4_ = local_2980._16_4_ * auVar67._16_4_;
              auVar167._20_4_ = local_2980._20_4_ * auVar67._20_4_;
              auVar167._24_4_ = local_2980._24_4_ * auVar67._24_4_;
              auVar167._28_4_ = 0;
              auVar173 = ZEXT3264(auVar167);
              auVar67 = vsubps_avx(ZEXT1632(auVar10),auVar47);
              auVar162._0_4_ = local_2960._0_4_ * auVar67._0_4_;
              auVar162._4_4_ = local_2960._4_4_ * auVar67._4_4_;
              auVar162._8_4_ = local_2960._8_4_ * auVar67._8_4_;
              auVar162._12_4_ = local_2960._12_4_ * auVar67._12_4_;
              auVar162._16_4_ = local_2960._16_4_ * auVar67._16_4_;
              auVar162._20_4_ = local_2960._20_4_ * auVar67._20_4_;
              auVar162._24_4_ = local_2960._24_4_ * auVar67._24_4_;
              auVar162._28_4_ = 0;
              auVar165 = ZEXT3264(auVar162);
              auVar67 = vsubps_avx(ZEXT1632(auVar11),auVar48);
              auVar135._0_4_ = auVar67._0_4_ * (float)local_2940._0_4_;
              auVar135._4_4_ = auVar67._4_4_ * (float)local_2940._4_4_;
              auVar135._8_4_ = auVar67._8_4_ * fStack_2938;
              auVar135._12_4_ = auVar67._12_4_ * fStack_2934;
              auVar135._16_4_ = auVar67._16_4_ * fStack_2930;
              auVar135._20_4_ = auVar67._20_4_ * fStack_292c;
              auVar135._24_4_ = auVar67._24_4_ * fStack_2928;
              auVar135._28_4_ = 0;
              auVar67 = vpminsd_avx2(auVar12,auVar167);
              auVar82 = vpminsd_avx2(auVar113,auVar162);
              auVar67 = vpmaxsd_avx2(auVar67,auVar82);
              auVar82 = vpminsd_avx2(auVar121,auVar135);
              auVar67 = vpmaxsd_avx2(auVar67,auVar82);
              auVar13._4_4_ = auVar67._4_4_ * 0.99999964;
              auVar13._0_4_ = auVar67._0_4_ * 0.99999964;
              auVar13._8_4_ = auVar67._8_4_ * 0.99999964;
              auVar13._12_4_ = auVar67._12_4_ * 0.99999964;
              auVar13._16_4_ = auVar67._16_4_ * 0.99999964;
              auVar13._20_4_ = auVar67._20_4_ * 0.99999964;
              auVar13._24_4_ = auVar67._24_4_ * 0.99999964;
              auVar13._28_4_ = auVar67._28_4_;
              auVar67 = vpmaxsd_avx2(auVar12,auVar167);
              auVar118 = vpmaxsd_avx2(auVar113,auVar162);
              auVar82 = vpminsd_avx2(auVar67,auVar118);
              auVar67 = vpmaxsd_avx2(auVar121,auVar135);
              auVar67 = vpminsd_avx2(auVar82,auVar67);
              auVar14._4_4_ = auVar67._4_4_ * 1.0000004;
              auVar14._0_4_ = auVar67._0_4_ * 1.0000004;
              auVar14._8_4_ = auVar67._8_4_ * 1.0000004;
              auVar14._12_4_ = auVar67._12_4_ * 1.0000004;
              auVar14._16_4_ = auVar67._16_4_ * 1.0000004;
              auVar14._20_4_ = auVar67._20_4_ * 1.0000004;
              auVar14._24_4_ = auVar67._24_4_ * 1.0000004;
              auVar14._28_4_ = auVar67._28_4_;
              auVar82 = vpmaxsd_avx2(auVar13,local_28c0);
              auVar67 = vpminsd_avx2(auVar14,local_28a0);
              auVar67 = vcmpps_avx(auVar82,auVar67,2);
              if ((uVar63 & 7) == 6) {
                uVar64 = *(undefined4 *)(uVar53 + 0xf0 + lVar55);
                auVar136._4_4_ = uVar64;
                auVar136._0_4_ = uVar64;
                auVar136._8_4_ = uVar64;
                auVar136._12_4_ = uVar64;
                auVar136._16_4_ = uVar64;
                auVar136._20_4_ = uVar64;
                auVar136._24_4_ = uVar64;
                auVar136._28_4_ = uVar64;
                auVar82 = vcmpps_avx(auVar136,auVar97,2);
                uVar64 = *(undefined4 *)(uVar53 + 0x100 + lVar55);
                auVar118._4_4_ = uVar64;
                auVar118._0_4_ = uVar64;
                auVar118._8_4_ = uVar64;
                auVar118._12_4_ = uVar64;
                auVar118._16_4_ = uVar64;
                auVar118._20_4_ = uVar64;
                auVar118._24_4_ = uVar64;
                auVar118._28_4_ = uVar64;
                auVar97 = vcmpps_avx(auVar97,auVar118,1);
                auVar97 = vandps_avx(auVar82,auVar97);
                auVar97 = vandps_avx(auVar97,auVar67);
                auVar96 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
              }
              else {
                auVar96 = vpackssdw_avx(auVar67._0_16_,auVar67._16_16_);
              }
              auVar152 = ZEXT3264(auVar118);
              auVar139 = ZEXT3264(auVar82);
              auVar66 = vpackssdw_avx(auVar81._0_16_,auVar81._16_16_);
              auVar96 = vpand_avx(auVar96,auVar66);
              auVar97 = vpmovzxwd_avx2(auVar96);
              auVar97 = vpslld_avx2(auVar97,0x1f);
              if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar97 >> 0x7f,0) == '\0') &&
                    (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar97 >> 0xbf,0) == '\0') &&
                  (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar97[0x1f]) {
                auVar106 = ZEXT3264(auVar75);
                uVar57 = root.ptr;
              }
              else {
                auVar123._8_4_ = 0x7f800000;
                auVar123._0_8_ = 0x7f8000007f800000;
                auVar123._12_4_ = 0x7f800000;
                auVar123._16_4_ = 0x7f800000;
                auVar123._20_4_ = 0x7f800000;
                auVar123._24_4_ = 0x7f800000;
                auVar123._28_4_ = 0x7f800000;
                auVar97 = vblendvps_avx(auVar123,auVar13,auVar97);
                auVar106 = ZEXT3264(auVar97);
                if (root.ptr != 8) {
                  *puVar62 = root.ptr;
                  puVar62 = puVar62 + 1;
                  *pauVar56 = auVar75;
                  pauVar56 = pauVar56 + 1;
                }
              }
              root.ptr = uVar57;
              auVar75 = auVar106._0_32_;
              lVar55 = lVar55 + 4;
            } while (lVar55 != 0);
            iVar51 = 4;
            if (root.ptr == 8) {
              auVar81 = vpcmpeqd_avx2(auVar75,auVar75);
              auVar86 = ZEXT3264(auVar81);
              goto LAB_019d26cd;
            }
            auVar81 = vcmpps_avx(local_28a0,auVar106._0_32_,6);
            uVar64 = vmovmskps_avx(auVar81);
            auVar81 = vpcmpeqd_avx2(auVar75,auVar75);
            auVar86 = ZEXT3264(auVar81);
          } while ((byte)uVar59 < (byte)POPCOUNT(uVar64));
          *puVar62 = root.ptr;
          puVar62 = puVar62 + 1;
          *pauVar56 = auVar106._0_32_;
          pauVar56 = pauVar56 + 1;
        }
        else {
          local_2c40._0_8_ = CONCAT44(0,POPCOUNT(uVar64));
          while (unaff_R15 != 0) {
            k = 0;
            for (uVar59 = unaff_R15; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            local_2c20._0_8_ = k;
            auVar81 = ZEXT1632(auVar86._0_16_);
            auVar139 = ZEXT1664(auVar139._0_16_);
            auVar152 = ZEXT1664(auVar152._0_16_);
            auVar165 = ZEXT1664(auVar165._0_16_);
            auVar173 = ZEXT1664(auVar173._0_16_);
            auVar181 = ZEXT1664(auVar181._0_16_);
            auVar185 = ZEXT1664(auVar185._0_16_);
            in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            bVar65 = occluded1(local_2bf8,local_2c00,root,k,&local_2d19,ray,
                               (TravRayK<8,_true> *)&local_2a40.field_0,context);
            if (bVar65) {
              *(undefined4 *)(local_2be0 + local_2c20._0_8_ * 4) = 0xffffffff;
            }
            unaff_R15 = unaff_R15 - 1 & unaff_R15;
            auVar81 = vpcmpeqd_avx2(auVar81,auVar81);
            auVar86 = ZEXT3264(auVar81);
            uVar59 = local_2d18;
            context = local_2d10;
          }
          auVar81 = auVar86._0_32_ & ~local_2be0;
          if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar81 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar81 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar81 >> 0x7f,0) == '\0') &&
                (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar81 >> 0xbf,0) == '\0') &&
              (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar81[0x1f]) {
            iVar51 = 3;
          }
          else {
            auVar105._8_4_ = 0xff800000;
            auVar105._0_8_ = 0xff800000ff800000;
            auVar105._12_4_ = 0xff800000;
            auVar105._16_4_ = 0xff800000;
            auVar105._20_4_ = 0xff800000;
            auVar105._24_4_ = 0xff800000;
            auVar105._28_4_ = 0xff800000;
            auVar81 = vblendvps_avx(local_28a0,auVar105,local_2be0);
            auVar97 = vpcmpeqd_avx2(local_28a0,local_28a0);
            auVar86 = ZEXT3264(auVar97);
            local_28a0 = auVar81;
            iVar51 = 2;
          }
          auVar106 = ZEXT3264(_local_2d00);
          unaff_R15 = 0;
          if ((uint)uVar59 < (uint)local_2c40._0_4_) goto LAB_019d1769;
        }
LAB_019d26cd:
      } while ((iVar51 == 4) || (iVar51 == 2));
LAB_019d2806:
      auVar81 = vandps_avx(local_2880,local_2be0);
      auVar85._8_4_ = 0xff800000;
      auVar85._0_8_ = 0xff800000ff800000;
      auVar85._12_4_ = 0xff800000;
      auVar85._16_4_ = 0xff800000;
      auVar85._20_4_ = 0xff800000;
      auVar85._24_4_ = 0xff800000;
      auVar85._28_4_ = 0xff800000;
      auVar81 = vmaskmovps_avx(auVar81,auVar85);
      *(undefined1 (*) [32])local_2cc8 = auVar81;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }